

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [16];
  Primitive *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  int iVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined6 uVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  int iVar50;
  ulong uVar51;
  RTCFilterFunctionN p_Var52;
  RTCRayN *pRVar53;
  undefined4 uVar54;
  RTCIntersectArguments *pRVar55;
  undefined1 *puVar56;
  ulong uVar57;
  Geometry *pGVar58;
  ulong uVar59;
  bool bVar60;
  ulong uVar61;
  Geometry *geometry;
  long lVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  short sVar69;
  undefined2 uVar99;
  float fVar70;
  float fVar71;
  float fVar100;
  float fVar102;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar101;
  float fVar103;
  undefined8 uVar104;
  float fVar105;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar106;
  float fVar107;
  float fVar130;
  float fVar132;
  vfloat4 v_2;
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar135;
  float fVar142;
  float fVar144;
  vfloat4 v;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar136;
  float fVar143;
  float fVar145;
  float fVar146;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar147;
  float fVar160;
  float fVar161;
  vfloat4 v_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar173;
  float fVar174;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar175;
  float fVar197;
  float fVar198;
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar199;
  float fVar203;
  float fVar205;
  undefined1 auVar200 [16];
  float fVar204;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar210;
  float fVar211;
  float fVar218;
  float fVar220;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  float fVar219;
  float fVar221;
  float fVar222;
  undefined1 auVar217 [16];
  float fVar223;
  float fVar225;
  float fVar226;
  undefined1 auVar224 [16];
  float fVar227;
  float fVar234;
  float fVar235;
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar236;
  float fVar237;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar260;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_4> bhit;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_438;
  undefined8 uStack_430;
  float local_418;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  ulong local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 (*local_328) [16];
  Precalculations *local_320;
  RTCFilterFunctionNArguments local_318;
  undefined1 local_2e8 [16];
  undefined8 local_2d8;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  LinearSpace3fa *local_218;
  Primitive *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  uint local_198;
  int local_194;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  float local_138 [4];
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118 [4];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 uVar98;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  
  PVar17 = prim[1];
  uVar51 = (ulong)(byte)PVar17;
  lVar22 = uVar51 * 0x25;
  pPVar8 = prim + lVar22 + 6;
  fVar144 = *(float *)(pPVar8 + 0xc);
  fVar147 = (*(float *)(ray + k * 4) - *(float *)pPVar8) * fVar144;
  fVar160 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar8 + 4)) * fVar144;
  fVar161 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar8 + 8)) * fVar144;
  fVar135 = *(float *)(ray + k * 4 + 0x40) * fVar144;
  fVar142 = *(float *)(ray + k * 4 + 0x50) * fVar144;
  fVar144 = *(float *)(ray + k * 4 + 0x60) * fVar144;
  uVar54 = *(undefined4 *)(prim + uVar51 * 4 + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar104 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar104 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar59 = CONCAT62(uVar24,sVar69);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar59;
  auVar72._12_2_ = uVar99;
  auVar72._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar104 >> 0x20);
  auVar138._12_4_ = auVar72._12_4_;
  auVar138._8_2_ = 0;
  auVar138._0_8_ = uVar59;
  auVar138._10_2_ = uVar99;
  auVar232._10_6_ = auVar138._10_6_;
  auVar232._8_2_ = uVar99;
  auVar232._0_8_ = uVar59;
  uVar99 = (undefined2)uVar24;
  auVar25._4_8_ = auVar232._8_8_;
  auVar25._2_2_ = uVar99;
  auVar25._0_2_ = uVar99;
  fVar272 = (float)((int)sVar69 >> 8);
  fVar279 = (float)(auVar25._0_4_ >> 0x18);
  fVar280 = (float)(auVar232._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar51 * 5 + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar104 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar104 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar59 = CONCAT62(uVar24,sVar69);
  auVar110._8_4_ = 0;
  auVar110._0_8_ = uVar59;
  auVar110._12_2_ = uVar99;
  auVar110._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar104 >> 0x20);
  auVar109._12_4_ = auVar110._12_4_;
  auVar109._8_2_ = 0;
  auVar109._0_8_ = uVar59;
  auVar109._10_2_ = uVar99;
  auVar108._10_6_ = auVar109._10_6_;
  auVar108._8_2_ = uVar99;
  auVar108._0_8_ = uVar59;
  uVar99 = (undefined2)uVar24;
  auVar26._4_8_ = auVar108._8_8_;
  auVar26._2_2_ = uVar99;
  auVar26._0_2_ = uVar99;
  fVar162 = (float)((int)sVar69 >> 8);
  fVar173 = (float)(auVar26._0_4_ >> 0x18);
  fVar174 = (float)(auVar108._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar51 * 6 + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar104 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar104 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar59 = CONCAT62(uVar24,sVar69);
  auVar113._8_4_ = 0;
  auVar113._0_8_ = uVar59;
  auVar113._12_2_ = uVar99;
  auVar113._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar104 >> 0x20);
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._8_2_ = 0;
  auVar112._0_8_ = uVar59;
  auVar112._10_2_ = uVar99;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._8_2_ = uVar99;
  auVar111._0_8_ = uVar59;
  uVar99 = (undefined2)uVar24;
  auVar27._4_8_ = auVar111._8_8_;
  auVar27._2_2_ = uVar99;
  auVar27._0_2_ = uVar99;
  fVar199 = (float)((int)sVar69 >> 8);
  fVar203 = (float)(auVar27._0_4_ >> 0x18);
  fVar205 = (float)(auVar111._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar51 * 0xf + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar104 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar104 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar59 = CONCAT62(uVar24,sVar69);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar59;
  auVar116._12_2_ = uVar99;
  auVar116._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar104 >> 0x20);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._8_2_ = 0;
  auVar115._0_8_ = uVar59;
  auVar115._10_2_ = uVar99;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._8_2_ = uVar99;
  auVar114._0_8_ = uVar59;
  uVar99 = (undefined2)uVar24;
  auVar28._4_8_ = auVar114._8_8_;
  auVar28._2_2_ = uVar99;
  auVar28._0_2_ = uVar99;
  fVar70 = (float)((int)sVar69 >> 8);
  fVar100 = (float)(auVar28._0_4_ >> 0x18);
  fVar102 = (float)(auVar114._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar104 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar104 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar59 = CONCAT62(uVar24,sVar69);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar59;
  auVar178._12_2_ = uVar99;
  auVar178._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar104 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar59;
  auVar177._10_2_ = uVar99;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar99;
  auVar176._0_8_ = uVar59;
  uVar99 = (undefined2)uVar24;
  auVar29._4_8_ = auVar176._8_8_;
  auVar29._2_2_ = uVar99;
  auVar29._0_2_ = uVar99;
  fVar210 = (float)((int)sVar69 >> 8);
  fVar218 = (float)(auVar29._0_4_ >> 0x18);
  fVar220 = (float)(auVar176._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar51 + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar104 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar104 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar59 = CONCAT62(uVar24,sVar69);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar59;
  auVar181._12_2_ = uVar99;
  auVar181._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar104 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar59;
  auVar180._10_2_ = uVar99;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar99;
  auVar179._0_8_ = uVar59;
  uVar99 = (undefined2)uVar24;
  auVar30._4_8_ = auVar179._8_8_;
  auVar30._2_2_ = uVar99;
  auVar30._0_2_ = uVar99;
  fVar227 = (float)((int)sVar69 >> 8);
  fVar234 = (float)(auVar30._0_4_ >> 0x18);
  fVar235 = (float)(auVar179._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar51 * 0x1a + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar104 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar104 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar59 = CONCAT62(uVar24,sVar69);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar59;
  auVar184._12_2_ = uVar99;
  auVar184._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar104 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar59;
  auVar183._10_2_ = uVar99;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar99;
  auVar182._0_8_ = uVar59;
  uVar99 = (undefined2)uVar24;
  auVar31._4_8_ = auVar182._8_8_;
  auVar31._2_2_ = uVar99;
  auVar31._0_2_ = uVar99;
  fVar223 = (float)((int)sVar69 >> 8);
  fVar225 = (float)(auVar31._0_4_ >> 0x18);
  fVar226 = (float)(auVar182._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar51 * 0x1b + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar104 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar104 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar59 = CONCAT62(uVar24,sVar69);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar59;
  auVar187._12_2_ = uVar99;
  auVar187._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar104 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar59;
  auVar186._10_2_ = uVar99;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar99;
  auVar185._0_8_ = uVar59;
  uVar99 = (undefined2)uVar24;
  auVar32._4_8_ = auVar185._8_8_;
  auVar32._2_2_ = uVar99;
  auVar32._0_2_ = uVar99;
  fVar236 = (float)((int)sVar69 >> 8);
  fVar242 = (float)(auVar32._0_4_ >> 0x18);
  fVar245 = (float)(auVar185._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar51 * 0x1c + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar104 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar104 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar59 = CONCAT62(uVar24,sVar69);
  auVar190._8_4_ = 0;
  auVar190._0_8_ = uVar59;
  auVar190._12_2_ = uVar99;
  auVar190._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar104 >> 0x20);
  auVar189._12_4_ = auVar190._12_4_;
  auVar189._8_2_ = 0;
  auVar189._0_8_ = uVar59;
  auVar189._10_2_ = uVar99;
  auVar188._10_6_ = auVar189._10_6_;
  auVar188._8_2_ = uVar99;
  auVar188._0_8_ = uVar59;
  uVar99 = (undefined2)uVar24;
  auVar33._4_8_ = auVar188._8_8_;
  auVar33._2_2_ = uVar99;
  auVar33._0_2_ = uVar99;
  fVar106 = (float)((int)sVar69 >> 8);
  fVar130 = (float)(auVar33._0_4_ >> 0x18);
  fVar132 = (float)(auVar188._8_4_ >> 0x18);
  fVar260 = fVar135 * fVar272 + fVar142 * fVar162 + fVar144 * fVar199;
  fVar269 = fVar135 * fVar279 + fVar142 * fVar173 + fVar144 * fVar203;
  fVar270 = fVar135 * fVar280 + fVar142 * fVar174 + fVar144 * fVar205;
  fVar271 = fVar135 * (float)(auVar138._12_4_ >> 0x18) +
            fVar142 * (float)(auVar109._12_4_ >> 0x18) + fVar144 * (float)(auVar112._12_4_ >> 0x18);
  fVar250 = fVar135 * fVar70 + fVar142 * fVar210 + fVar144 * fVar227;
  fVar257 = fVar135 * fVar100 + fVar142 * fVar218 + fVar144 * fVar234;
  fVar258 = fVar135 * fVar102 + fVar142 * fVar220 + fVar144 * fVar235;
  fVar259 = fVar135 * (float)(auVar115._12_4_ >> 0x18) +
            fVar142 * (float)(auVar177._12_4_ >> 0x18) + fVar144 * (float)(auVar180._12_4_ >> 0x18);
  fVar175 = fVar135 * fVar223 + fVar142 * fVar236 + fVar144 * fVar106;
  fVar197 = fVar135 * fVar225 + fVar142 * fVar242 + fVar144 * fVar130;
  fVar198 = fVar135 * fVar226 + fVar142 * fVar245 + fVar144 * fVar132;
  fVar135 = fVar135 * (float)(auVar183._12_4_ >> 0x18) +
            fVar142 * (float)(auVar186._12_4_ >> 0x18) + fVar144 * (float)(auVar189._12_4_ >> 0x18);
  fVar273 = fVar272 * fVar147 + fVar162 * fVar160 + fVar199 * fVar161;
  fVar279 = fVar279 * fVar147 + fVar173 * fVar160 + fVar203 * fVar161;
  fVar280 = fVar280 * fVar147 + fVar174 * fVar160 + fVar205 * fVar161;
  fVar281 = (float)(auVar138._12_4_ >> 0x18) * fVar147 +
            (float)(auVar109._12_4_ >> 0x18) * fVar160 + (float)(auVar112._12_4_ >> 0x18) * fVar161;
  fVar227 = fVar70 * fVar147 + fVar210 * fVar160 + fVar227 * fVar161;
  fVar234 = fVar100 * fVar147 + fVar218 * fVar160 + fVar234 * fVar161;
  fVar235 = fVar102 * fVar147 + fVar220 * fVar160 + fVar235 * fVar161;
  fVar272 = (float)(auVar115._12_4_ >> 0x18) * fVar147 +
            (float)(auVar177._12_4_ >> 0x18) * fVar160 + (float)(auVar180._12_4_ >> 0x18) * fVar161;
  fVar223 = fVar147 * fVar223 + fVar160 * fVar236 + fVar161 * fVar106;
  fVar225 = fVar147 * fVar225 + fVar160 * fVar242 + fVar161 * fVar130;
  fVar226 = fVar147 * fVar226 + fVar160 * fVar245 + fVar161 * fVar132;
  fVar236 = fVar147 * (float)(auVar183._12_4_ >> 0x18) +
            fVar160 * (float)(auVar186._12_4_ >> 0x18) + fVar161 * (float)(auVar189._12_4_ >> 0x18);
  fVar144 = (float)DAT_01f80d30;
  fVar70 = DAT_01f80d30._4_4_;
  fVar100 = DAT_01f80d30._8_4_;
  fVar102 = DAT_01f80d30._12_4_;
  uVar63 = -(uint)(fVar144 <= ABS(fVar260));
  uVar64 = -(uint)(fVar70 <= ABS(fVar269));
  uVar65 = -(uint)(fVar100 <= ABS(fVar270));
  uVar66 = -(uint)(fVar102 <= ABS(fVar271));
  auVar261._0_4_ = (uint)fVar260 & uVar63;
  auVar261._4_4_ = (uint)fVar269 & uVar64;
  auVar261._8_4_ = (uint)fVar270 & uVar65;
  auVar261._12_4_ = (uint)fVar271 & uVar66;
  auVar148._0_4_ = ~uVar63 & (uint)fVar144;
  auVar148._4_4_ = ~uVar64 & (uint)fVar70;
  auVar148._8_4_ = ~uVar65 & (uint)fVar100;
  auVar148._12_4_ = ~uVar66 & (uint)fVar102;
  auVar148 = auVar148 | auVar261;
  uVar63 = -(uint)(fVar144 <= ABS(fVar250));
  uVar64 = -(uint)(fVar70 <= ABS(fVar257));
  uVar65 = -(uint)(fVar100 <= ABS(fVar258));
  uVar66 = -(uint)(fVar102 <= ABS(fVar259));
  auVar251._0_4_ = (uint)fVar250 & uVar63;
  auVar251._4_4_ = (uint)fVar257 & uVar64;
  auVar251._8_4_ = (uint)fVar258 & uVar65;
  auVar251._12_4_ = (uint)fVar259 & uVar66;
  auVar200._0_4_ = ~uVar63 & (uint)fVar144;
  auVar200._4_4_ = ~uVar64 & (uint)fVar70;
  auVar200._8_4_ = ~uVar65 & (uint)fVar100;
  auVar200._12_4_ = ~uVar66 & (uint)fVar102;
  auVar200 = auVar200 | auVar251;
  uVar63 = -(uint)(fVar144 <= ABS(fVar175));
  uVar64 = -(uint)(fVar70 <= ABS(fVar197));
  uVar65 = -(uint)(fVar100 <= ABS(fVar198));
  uVar66 = -(uint)(fVar102 <= ABS(fVar135));
  auVar191._0_4_ = (uint)fVar175 & uVar63;
  auVar191._4_4_ = (uint)fVar197 & uVar64;
  auVar191._8_4_ = (uint)fVar198 & uVar65;
  auVar191._12_4_ = (uint)fVar135 & uVar66;
  auVar212._0_4_ = ~uVar63 & (uint)fVar144;
  auVar212._4_4_ = ~uVar64 & (uint)fVar70;
  auVar212._8_4_ = ~uVar65 & (uint)fVar100;
  auVar212._12_4_ = ~uVar66 & (uint)fVar102;
  auVar212 = auVar212 | auVar191;
  auVar72 = rcpps(_DAT_01f80d30,auVar148);
  fVar144 = auVar72._0_4_;
  fVar102 = auVar72._4_4_;
  fVar162 = auVar72._8_4_;
  fVar210 = auVar72._12_4_;
  fVar144 = (1.0 - auVar148._0_4_ * fVar144) * fVar144 + fVar144;
  fVar102 = (1.0 - auVar148._4_4_ * fVar102) * fVar102 + fVar102;
  fVar162 = (1.0 - auVar148._8_4_ * fVar162) * fVar162 + fVar162;
  fVar210 = (1.0 - auVar148._12_4_ * fVar210) * fVar210 + fVar210;
  auVar72 = rcpps(auVar72,auVar200);
  fVar70 = auVar72._0_4_;
  fVar106 = auVar72._4_4_;
  fVar173 = auVar72._8_4_;
  fVar218 = auVar72._12_4_;
  fVar70 = (1.0 - auVar200._0_4_ * fVar70) * fVar70 + fVar70;
  fVar106 = (1.0 - auVar200._4_4_ * fVar106) * fVar106 + fVar106;
  fVar173 = (1.0 - auVar200._8_4_ * fVar173) * fVar173 + fVar173;
  fVar218 = (1.0 - auVar200._12_4_ * fVar218) * fVar218 + fVar218;
  auVar72 = rcpps(auVar72,auVar212);
  fVar100 = auVar72._0_4_;
  fVar130 = auVar72._4_4_;
  fVar174 = auVar72._8_4_;
  fVar220 = auVar72._12_4_;
  fVar100 = (1.0 - auVar212._0_4_ * fVar100) * fVar100 + fVar100;
  fVar130 = (1.0 - auVar212._4_4_ * fVar130) * fVar130 + fVar130;
  fVar174 = (1.0 - auVar212._8_4_ * fVar174) * fVar174 + fVar174;
  fVar220 = (1.0 - auVar212._12_4_ * fVar220) * fVar220 + fVar220;
  fVar242 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  uVar59 = *(ulong *)(prim + uVar51 * 7 + 6);
  uVar99 = (undefined2)(uVar59 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar59;
  auVar75._12_2_ = uVar99;
  auVar75._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar59 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar59;
  auVar74._10_2_ = uVar99;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar99;
  auVar73._0_8_ = uVar59;
  uVar99 = (undefined2)(uVar59 >> 0x10);
  auVar34._4_8_ = auVar73._8_8_;
  auVar34._2_2_ = uVar99;
  auVar34._0_2_ = uVar99;
  fVar132 = (float)(auVar34._0_4_ >> 0x10);
  fVar175 = (float)(auVar73._8_4_ >> 0x10);
  uVar61 = *(ulong *)(prim + uVar51 * 0xb + 6);
  uVar99 = (undefined2)(uVar61 >> 0x30);
  auVar151._8_4_ = 0;
  auVar151._0_8_ = uVar61;
  auVar151._12_2_ = uVar99;
  auVar151._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar61 >> 0x20);
  auVar150._12_4_ = auVar151._12_4_;
  auVar150._8_2_ = 0;
  auVar150._0_8_ = uVar61;
  auVar150._10_2_ = uVar99;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._8_2_ = uVar99;
  auVar149._0_8_ = uVar61;
  uVar99 = (undefined2)(uVar61 >> 0x10);
  auVar35._4_8_ = auVar149._8_8_;
  auVar35._2_2_ = uVar99;
  auVar35._0_2_ = uVar99;
  uVar9 = *(ulong *)(prim + uVar51 * 9 + 6);
  uVar99 = (undefined2)(uVar9 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar9;
  auVar78._12_2_ = uVar99;
  auVar78._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar9 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar9;
  auVar77._10_2_ = uVar99;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar99;
  auVar76._0_8_ = uVar9;
  uVar99 = (undefined2)(uVar9 >> 0x10);
  auVar36._4_8_ = auVar76._8_8_;
  auVar36._2_2_ = uVar99;
  auVar36._0_2_ = uVar99;
  fVar135 = (float)(auVar36._0_4_ >> 0x10);
  fVar197 = (float)(auVar76._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar51 * 0xd + 6);
  uVar99 = (undefined2)(uVar10 >> 0x30);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar10;
  auVar215._12_2_ = uVar99;
  auVar215._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar10 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar10;
  auVar214._10_2_ = uVar99;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar99;
  auVar213._0_8_ = uVar10;
  uVar99 = (undefined2)(uVar10 >> 0x10);
  auVar37._4_8_ = auVar213._8_8_;
  auVar37._2_2_ = uVar99;
  auVar37._0_2_ = uVar99;
  uVar11 = *(ulong *)(prim + uVar51 * 0x12 + 6);
  uVar99 = (undefined2)(uVar11 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar11;
  auVar81._12_2_ = uVar99;
  auVar81._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar11 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar11;
  auVar80._10_2_ = uVar99;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar99;
  auVar79._0_8_ = uVar11;
  uVar99 = (undefined2)(uVar11 >> 0x10);
  auVar38._4_8_ = auVar79._8_8_;
  auVar38._2_2_ = uVar99;
  auVar38._0_2_ = uVar99;
  fVar142 = (float)(auVar38._0_4_ >> 0x10);
  fVar198 = (float)(auVar79._8_4_ >> 0x10);
  uVar57 = (ulong)(uint)((int)(uVar51 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar51 * 2 + uVar57 + 6);
  uVar99 = (undefined2)(uVar12 >> 0x30);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar12;
  auVar230._12_2_ = uVar99;
  auVar230._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar12 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar12;
  auVar229._10_2_ = uVar99;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar99;
  auVar228._0_8_ = uVar12;
  uVar99 = (undefined2)(uVar12 >> 0x10);
  auVar39._4_8_ = auVar228._8_8_;
  auVar39._2_2_ = uVar99;
  auVar39._0_2_ = uVar99;
  uVar57 = *(ulong *)(prim + uVar57 + 6);
  uVar99 = (undefined2)(uVar57 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar57;
  auVar84._12_2_ = uVar99;
  auVar84._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar57 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar57;
  auVar83._10_2_ = uVar99;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar99;
  auVar82._0_8_ = uVar57;
  uVar99 = (undefined2)(uVar57 >> 0x10);
  auVar40._4_8_ = auVar82._8_8_;
  auVar40._2_2_ = uVar99;
  auVar40._0_2_ = uVar99;
  fVar147 = (float)(auVar40._0_4_ >> 0x10);
  fVar199 = (float)(auVar82._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar51 * 0x18 + 6);
  uVar99 = (undefined2)(uVar13 >> 0x30);
  auVar240._8_4_ = 0;
  auVar240._0_8_ = uVar13;
  auVar240._12_2_ = uVar99;
  auVar240._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar13 >> 0x20);
  auVar239._12_4_ = auVar240._12_4_;
  auVar239._8_2_ = 0;
  auVar239._0_8_ = uVar13;
  auVar239._10_2_ = uVar99;
  auVar238._10_6_ = auVar239._10_6_;
  auVar238._8_2_ = uVar99;
  auVar238._0_8_ = uVar13;
  uVar99 = (undefined2)(uVar13 >> 0x10);
  auVar41._4_8_ = auVar238._8_8_;
  auVar41._2_2_ = uVar99;
  auVar41._0_2_ = uVar99;
  uVar14 = *(ulong *)(prim + uVar51 * 0x1d + 6);
  uVar99 = (undefined2)(uVar14 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar14;
  auVar87._12_2_ = uVar99;
  auVar87._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar14 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar14;
  auVar86._10_2_ = uVar99;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar99;
  auVar85._0_8_ = uVar14;
  uVar99 = (undefined2)(uVar14 >> 0x10);
  auVar42._4_8_ = auVar85._8_8_;
  auVar42._2_2_ = uVar99;
  auVar42._0_2_ = uVar99;
  fVar160 = (float)(auVar42._0_4_ >> 0x10);
  fVar203 = (float)(auVar85._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar51 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar99 = (undefined2)(uVar15 >> 0x30);
  auVar254._8_4_ = 0;
  auVar254._0_8_ = uVar15;
  auVar254._12_2_ = uVar99;
  auVar254._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar15 >> 0x20);
  auVar253._12_4_ = auVar254._12_4_;
  auVar253._8_2_ = 0;
  auVar253._0_8_ = uVar15;
  auVar253._10_2_ = uVar99;
  auVar252._10_6_ = auVar253._10_6_;
  auVar252._8_2_ = uVar99;
  auVar252._0_8_ = uVar15;
  uVar99 = (undefined2)(uVar15 >> 0x10);
  auVar43._4_8_ = auVar252._8_8_;
  auVar43._2_2_ = uVar99;
  auVar43._0_2_ = uVar99;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar51) + 6);
  uVar99 = (undefined2)(uVar16 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar16;
  auVar90._12_2_ = uVar99;
  auVar90._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar16 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar16;
  auVar89._10_2_ = uVar99;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar99;
  auVar88._0_8_ = uVar16;
  uVar99 = (undefined2)(uVar16 >> 0x10);
  auVar44._4_8_ = auVar88._8_8_;
  auVar44._2_2_ = uVar99;
  auVar44._0_2_ = uVar99;
  fVar161 = (float)(auVar44._0_4_ >> 0x10);
  fVar205 = (float)(auVar88._8_4_ >> 0x10);
  uVar51 = *(ulong *)(prim + uVar51 * 0x23 + 6);
  uVar99 = (undefined2)(uVar51 >> 0x30);
  auVar264._8_4_ = 0;
  auVar264._0_8_ = uVar51;
  auVar264._12_2_ = uVar99;
  auVar264._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar51 >> 0x20);
  auVar263._12_4_ = auVar264._12_4_;
  auVar263._8_2_ = 0;
  auVar263._0_8_ = uVar51;
  auVar263._10_2_ = uVar99;
  auVar262._10_6_ = auVar263._10_6_;
  auVar262._8_2_ = uVar99;
  auVar262._0_8_ = uVar51;
  uVar99 = (undefined2)(uVar51 >> 0x10);
  auVar45._4_8_ = auVar262._8_8_;
  auVar45._2_2_ = uVar99;
  auVar45._0_2_ = uVar99;
  auVar152._0_8_ =
       CONCAT44(((((float)(auVar35._0_4_ >> 0x10) - fVar132) * fVar242 + fVar132) - fVar279) *
                fVar102,((((float)(int)(short)uVar61 - (float)(int)(short)uVar59) * fVar242 +
                         (float)(int)(short)uVar59) - fVar273) * fVar144);
  auVar152._8_4_ =
       ((((float)(auVar149._8_4_ >> 0x10) - fVar175) * fVar242 + fVar175) - fVar280) * fVar162;
  auVar152._12_4_ =
       ((((float)(auVar150._12_4_ >> 0x10) - (float)(auVar74._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar74._12_4_ >> 0x10)) - fVar281) * fVar210;
  auVar216._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar242 + (float)(int)(short)uVar9
        ) - fVar273) * fVar144;
  auVar216._4_4_ =
       ((((float)(auVar37._0_4_ >> 0x10) - fVar135) * fVar242 + fVar135) - fVar279) * fVar102;
  auVar216._8_4_ =
       ((((float)(auVar213._8_4_ >> 0x10) - fVar197) * fVar242 + fVar197) - fVar280) * fVar162;
  auVar216._12_4_ =
       ((((float)(auVar214._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar281) * fVar210;
  auVar231._0_8_ =
       CONCAT44(((((float)(auVar39._0_4_ >> 0x10) - fVar142) * fVar242 + fVar142) - fVar234) *
                fVar106,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar242 +
                         (float)(int)(short)uVar11) - fVar227) * fVar70);
  auVar231._8_4_ =
       ((((float)(auVar228._8_4_ >> 0x10) - fVar198) * fVar242 + fVar198) - fVar235) * fVar173;
  auVar231._12_4_ =
       ((((float)(auVar229._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar272) * fVar218;
  auVar241._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar57) * fVar242 +
        (float)(int)(short)uVar57) - fVar227) * fVar70;
  auVar241._4_4_ =
       ((((float)(auVar41._0_4_ >> 0x10) - fVar147) * fVar242 + fVar147) - fVar234) * fVar106;
  auVar241._8_4_ =
       ((((float)(auVar238._8_4_ >> 0x10) - fVar199) * fVar242 + fVar199) - fVar235) * fVar173;
  auVar241._12_4_ =
       ((((float)(auVar239._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar272) * fVar218;
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar255._0_8_ =
       CONCAT44(((((float)(auVar43._0_4_ >> 0x10) - fVar160) * fVar242 + fVar160) - fVar225) *
                fVar130,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar242 +
                         (float)(int)(short)uVar14) - fVar223) * fVar100);
  auVar255._8_4_ =
       ((((float)(auVar252._8_4_ >> 0x10) - fVar203) * fVar242 + fVar203) - fVar226) * fVar174;
  auVar255._12_4_ =
       ((((float)(auVar253._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar236) * fVar220;
  auVar265._0_4_ =
       ((((float)(int)(short)uVar51 - (float)(int)(short)uVar16) * fVar242 +
        (float)(int)(short)uVar16) - fVar223) * fVar100;
  auVar265._4_4_ =
       ((((float)(auVar45._0_4_ >> 0x10) - fVar161) * fVar242 + fVar161) - fVar225) * fVar130;
  auVar265._8_4_ =
       ((((float)(auVar262._8_4_ >> 0x10) - fVar205) * fVar242 + fVar205) - fVar226) * fVar174;
  auVar265._12_4_ =
       ((((float)(auVar263._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar236) * fVar220;
  auVar137._8_4_ = auVar152._8_4_;
  auVar137._0_8_ = auVar152._0_8_;
  auVar137._12_4_ = auVar152._12_4_;
  auVar138 = minps(auVar137,auVar216);
  auVar117._8_4_ = auVar231._8_4_;
  auVar117._0_8_ = auVar231._0_8_;
  auVar117._12_4_ = auVar231._12_4_;
  auVar72 = minps(auVar117,auVar241);
  auVar138 = maxps(auVar138,auVar72);
  auVar118._8_4_ = auVar255._8_4_;
  auVar118._0_8_ = auVar255._0_8_;
  auVar118._12_4_ = auVar255._12_4_;
  auVar72 = minps(auVar118,auVar265);
  auVar91._4_4_ = uVar54;
  auVar91._0_4_ = uVar54;
  auVar91._8_4_ = uVar54;
  auVar91._12_4_ = uVar54;
  auVar72 = maxps(auVar72,auVar91);
  auVar72 = maxps(auVar138,auVar72);
  auVar138 = maxps(auVar152,auVar216);
  auVar232 = maxps(auVar231,auVar241);
  auVar138 = minps(auVar138,auVar232);
  local_48 = auVar72._0_4_ * 0.99999964;
  fStack_44 = auVar72._4_4_ * 0.99999964;
  fStack_40 = auVar72._8_4_ * 0.99999964;
  fStack_3c = auVar72._12_4_ * 0.99999964;
  auVar72 = maxps(auVar255,auVar265);
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar92._4_4_ = uVar54;
  auVar92._0_4_ = uVar54;
  auVar92._8_4_ = uVar54;
  auVar92._12_4_ = uVar54;
  auVar72 = minps(auVar72,auVar92);
  auVar72 = minps(auVar138,auVar72);
  uVar63 = (uint)(byte)PVar17;
  auVar119._0_4_ = -(uint)(uVar63 != 0 && local_48 <= auVar72._0_4_ * 1.0000004);
  auVar119._4_4_ = -(uint)(1 < uVar63 && fStack_44 <= auVar72._4_4_ * 1.0000004);
  auVar119._8_4_ = -(uint)(2 < uVar63 && fStack_40 <= auVar72._8_4_ * 1.0000004);
  auVar119._12_4_ = -(uint)(3 < uVar63 && fStack_3c <= auVar72._12_4_ * 1.0000004);
  uVar63 = movmskps(uVar63,auVar119);
  if (uVar63 != 0) {
    uVar63 = uVar63 & 0xff;
    local_218 = pre->ray_space + k;
    local_3b8 = mm_lookupmask_ps._0_8_;
    uStack_3b0 = mm_lookupmask_ps._8_8_;
    local_328 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_320 = pre;
    local_210 = prim;
    do {
      lVar22 = 0;
      if (uVar63 != 0) {
        for (; (uVar63 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      local_3c0 = (ulong)*(uint *)(local_210 + 2);
      local_2d8 = (ulong)*(uint *)(local_210 + lVar22 * 4 + 6);
      pGVar19 = (context->scene->geometries).items[local_3c0].ptr;
      uVar59 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                               local_2d8 *
                               pGVar19[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar144 = pGVar19->fnumTimeSegments;
      fVar70 = (pGVar19->time_range).lower;
      fVar100 = ((*(float *)(ray + k * 4 + 0x70) - fVar70) / ((pGVar19->time_range).upper - fVar70))
                * fVar144;
      fVar70 = floorf(fVar100);
      fVar144 = fVar144 + -1.0;
      if (fVar144 <= fVar70) {
        fVar70 = fVar144;
      }
      fVar144 = 0.0;
      if (0.0 <= fVar70) {
        fVar144 = fVar70;
      }
      _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      pGVar58 = (Geometry *)((long)(int)fVar144 * 0x38);
      lVar22 = *(long *)((long)&pGVar58->device + _Var20);
      lVar62 = *(long *)((long)&pGVar58->modCounter_ + _Var20);
      lVar21 = *(long *)((long)&pGVar58->occlusionFilterN + _Var20);
      pfVar1 = (float *)(lVar62 + uVar59 * lVar21);
      pfVar2 = (float *)(lVar62 + (uVar59 + 1) * lVar21);
      pfVar3 = (float *)(lVar62 + (uVar59 + 2) * lVar21);
      fVar100 = fVar100 - fVar144;
      fVar144 = 1.0 - fVar100;
      pfVar4 = (float *)(lVar62 + lVar21 * (uVar59 + 3));
      lVar62 = *(long *)((long)&(pGVar58->super_RefCount)._vptr_RefCount + _Var20);
      pfVar5 = (float *)(lVar62 + lVar22 * uVar59);
      pfVar6 = (float *)(lVar62 + lVar22 * (uVar59 + 1));
      local_2a8 = *pfVar5 * fVar144 + *pfVar1 * fVar100;
      fStack_2a4 = pfVar5[1] * fVar144 + pfVar1[1] * fVar100;
      fStack_2a0 = pfVar5[2] * fVar144 + pfVar1[2] * fVar100;
      fStack_29c = pfVar5[3] * fVar144 + pfVar1[3] * fVar100;
      local_2b8 = *pfVar6 * fVar144 + *pfVar2 * fVar100;
      fStack_2b4 = pfVar6[1] * fVar144 + pfVar2[1] * fVar100;
      fStack_2b0 = pfVar6[2] * fVar144 + pfVar2[2] * fVar100;
      fStack_2ac = pfVar6[3] * fVar144 + pfVar2[3] * fVar100;
      pfVar1 = (float *)(lVar62 + lVar22 * (uVar59 + 2));
      local_2c8 = *pfVar1 * fVar144 + *pfVar3 * fVar100;
      fStack_2c4 = pfVar1[1] * fVar144 + pfVar3[1] * fVar100;
      fStack_2c0 = pfVar1[2] * fVar144 + pfVar3[2] * fVar100;
      fStack_2bc = pfVar1[3] * fVar144 + pfVar3[3] * fVar100;
      pfVar1 = (float *)(lVar62 + lVar22 * (uVar59 + 3));
      local_298 = fVar144 * *pfVar1 + fVar100 * *pfVar4;
      fStack_294 = fVar144 * pfVar1[1] + fVar100 * pfVar4[1];
      fStack_290 = fVar144 * pfVar1[2] + fVar100 * pfVar4[2];
      fStack_28c = fVar144 * pfVar1[3] + fVar100 * pfVar4[3];
      iVar18 = (int)pGVar19[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar144 = *(float *)(ray + k * 4);
      fVar70 = *(float *)(ray + k * 4 + 0x10);
      fVar100 = *(float *)(ray + k * 4 + 0x20);
      fVar162 = local_2a8 - fVar144;
      fVar173 = fStack_2a4 - fVar70;
      fVar174 = fStack_2a0 - fVar100;
      fVar102 = (local_218->vx).field_0.m128[0];
      fVar106 = (local_218->vx).field_0.m128[1];
      fVar130 = (local_218->vx).field_0.m128[2];
      fVar132 = (local_218->vy).field_0.m128[0];
      fVar135 = (local_218->vy).field_0.m128[1];
      fVar142 = (local_218->vy).field_0.m128[2];
      fVar147 = (local_218->vz).field_0.m128[0];
      fVar160 = (local_218->vz).field_0.m128[1];
      fVar161 = (local_218->vz).field_0.m128[2];
      local_1d8 = fVar162 * fVar102 + fVar173 * fVar132 + fVar174 * fVar147;
      local_238 = fVar162 * fVar106 + fVar173 * fVar135 + fVar174 * fVar160;
      fVar162 = fVar162 * fVar130 + fVar173 * fVar142 + fVar174 * fVar161;
      fVar173 = local_2b8 - fVar144;
      fVar174 = fStack_2b4 - fVar70;
      fVar175 = fStack_2b0 - fVar100;
      fVar198 = fVar173 * fVar102 + fVar174 * fVar132 + fVar175 * fVar147;
      fVar199 = fVar173 * fVar106 + fVar174 * fVar135 + fVar175 * fVar160;
      local_358 = fVar173 * fVar130 + fVar174 * fVar142 + fVar175 * fVar161;
      fVar173 = local_2c8 - fVar144;
      fVar174 = fStack_2c4 - fVar70;
      fVar175 = fStack_2c0 - fVar100;
      fVar197 = fVar173 * fVar102 + fVar174 * fVar132 + fVar175 * fVar147;
      local_338 = fVar173 * fVar106 + fVar174 * fVar135 + fVar175 * fVar160;
      local_368 = fVar173 * fVar130 + fVar174 * fVar142 + fVar175 * fVar161;
      fVar144 = local_298 - fVar144;
      fVar70 = fStack_294 - fVar70;
      fVar100 = fStack_290 - fVar100;
      fVar102 = fVar144 * fVar102 + fVar70 * fVar132 + fVar100 * fVar147;
      local_348 = fVar144 * fVar106 + fVar70 * fVar135 + fVar100 * fVar160;
      local_378 = fVar144 * fVar130 + fVar70 * fVar142 + fVar100 * fVar161;
      auVar153._0_8_ = CONCAT44(local_238,local_1d8) & 0x7fffffff7fffffff;
      auVar153._8_4_ = ABS(fVar162);
      auVar153._12_4_ = ABS(fStack_29c);
      auVar163._0_8_ = CONCAT44(fVar199,fVar198) & 0x7fffffff7fffffff;
      auVar163._8_4_ = ABS(local_358);
      auVar163._12_4_ = ABS(fStack_2ac);
      auVar72 = maxps(auVar153,auVar163);
      auVar192._0_8_ = CONCAT44(local_338,fVar197) & 0x7fffffff7fffffff;
      auVar192._8_4_ = ABS(local_368);
      auVar192._12_4_ = ABS(fStack_2bc);
      auVar120._0_8_ = CONCAT44(local_348,fVar102) & 0x7fffffff7fffffff;
      auVar120._8_4_ = ABS(local_378);
      auVar120._12_4_ = ABS(fStack_28c);
      auVar138 = maxps(auVar192,auVar120);
      auVar72 = maxps(auVar72,auVar138);
      uVar104 = auVar72._8_8_;
      fVar144 = auVar72._4_4_;
      if (auVar72._4_4_ <= auVar72._0_4_) {
        fVar144 = auVar72._0_4_;
      }
      auVar154._8_8_ = uVar104;
      auVar154._0_8_ = uVar104;
      fVar70 = (float)iVar18;
      local_2e8 = ZEXT416((uint)fVar70);
      if (auVar72._8_4_ <= fVar144) {
        auVar155._4_12_ = auVar154._4_12_;
        auVar155._0_4_ = fVar144;
        uVar104 = auVar155._0_8_;
      }
      pRVar55 = (RTCIntersectArguments *)((long)iVar18 * 0x40);
      lVar22 = (long)iVar18 * 0x44;
      fVar100 = *(float *)(bspline_basis0 + lVar22 + 0x908);
      fVar106 = *(float *)(bspline_basis0 + lVar22 + 0x90c);
      fVar130 = *(float *)(bspline_basis0 + lVar22 + 0x910);
      fVar132 = *(float *)(bspline_basis0 + lVar22 + 0x914);
      fVar135 = *(float *)(bspline_basis0 + lVar22 + 0xd8c);
      fVar142 = *(float *)(bspline_basis0 + lVar22 + 0xd90);
      fVar147 = *(float *)(bspline_basis0 + lVar22 + 0xd94);
      fVar160 = *(float *)(bspline_basis0 + lVar22 + 0xd98);
      local_3a8 = *(float *)(bspline_basis0 + lVar22 + 0x484);
      fStack_3a4 = *(float *)(bspline_basis0 + lVar22 + 0x488);
      fStack_3a0 = *(float *)(bspline_basis0 + lVar22 + 0x48c);
      fStack_39c = *(float *)(bspline_basis0 + lVar22 + 0x490);
      pauVar7 = (undefined1 (*) [16])(bspline_basis0 + lVar22);
      fVar144 = *(float *)*pauVar7;
      fVar161 = *(float *)(bspline_basis0 + lVar22 + 4);
      fVar173 = *(float *)(bspline_basis0 + lVar22 + 8);
      auVar25 = *(undefined1 (*) [12])*pauVar7;
      fVar174 = *(float *)(bspline_basis0 + lVar22 + 0xc);
      _local_258 = *pauVar7;
      local_398 = local_1d8 * fVar144 + fVar198 * local_3a8 + fVar197 * fVar100 + fVar102 * fVar135;
      fStack_394 = local_1d8 * fVar161 +
                   fVar198 * fStack_3a4 + fVar197 * fVar106 + fVar102 * fVar142;
      fStack_390 = local_1d8 * fVar173 +
                   fVar198 * fStack_3a0 + fVar197 * fVar130 + fVar102 * fVar147;
      fStack_38c = local_1d8 * fVar174 +
                   fVar198 * fStack_39c + fVar197 * fVar132 + fVar102 * fVar160;
      local_248 = local_238 * fVar144 +
                  fVar199 * local_3a8 + local_338 * fVar100 + local_348 * fVar135;
      fStack_244 = local_238 * fVar161 +
                   fVar199 * fStack_3a4 + local_338 * fVar106 + local_348 * fVar142;
      fStack_240 = local_238 * fVar173 +
                   fVar199 * fStack_3a0 + local_338 * fVar130 + local_348 * fVar147;
      fStack_23c = local_238 * fVar174 +
                   fVar199 * fStack_39c + local_338 * fVar132 + local_348 * fVar160;
      auVar266._0_4_ =
           fStack_29c * fVar144 +
           fStack_2ac * local_3a8 + fStack_2bc * fVar100 + fStack_28c * fVar135;
      auVar266._4_4_ =
           fStack_29c * fVar161 +
           fStack_2ac * fStack_3a4 + fStack_2bc * fVar106 + fStack_28c * fVar142;
      auVar266._8_4_ =
           fStack_29c * fVar173 +
           fStack_2ac * fStack_3a0 + fStack_2bc * fVar130 + fStack_28c * fVar147;
      auVar266._12_4_ =
           fStack_29c * fVar174 +
           fStack_2ac * fStack_39c + fStack_2bc * fVar132 + fStack_28c * fVar160;
      fVar161 = *(float *)(bspline_basis1 + lVar22 + 0xd8c);
      fVar173 = *(float *)(bspline_basis1 + lVar22 + 0xd90);
      fVar175 = *(float *)(bspline_basis1 + lVar22 + 0xd94);
      fVar203 = *(float *)(bspline_basis1 + lVar22 + 0xd98);
      fVar205 = *(float *)(bspline_basis1 + lVar22 + 0x908);
      fVar210 = *(float *)(bspline_basis1 + lVar22 + 0x90c);
      fVar218 = *(float *)(bspline_basis1 + lVar22 + 0x910);
      fVar220 = *(float *)(bspline_basis1 + lVar22 + 0x914);
      fVar227 = *(float *)(bspline_basis1 + lVar22 + 0x484);
      fVar234 = *(float *)(bspline_basis1 + lVar22 + 0x488);
      fVar235 = *(float *)(bspline_basis1 + lVar22 + 0x48c);
      fVar272 = *(float *)(bspline_basis1 + lVar22 + 0x490);
      fVar223 = *(float *)(bspline_basis1 + lVar22);
      fVar225 = *(float *)(bspline_basis1 + lVar22 + 4);
      fVar226 = *(float *)(bspline_basis1 + lVar22 + 8);
      fVar236 = *(float *)(bspline_basis1 + lVar22 + 0xc);
      fVar279 = local_1d8 * fVar223 + fVar198 * fVar227 + fVar197 * fVar205 + fVar102 * fVar161;
      fVar281 = local_1d8 * fVar225 + fVar198 * fVar234 + fVar197 * fVar210 + fVar102 * fVar173;
      fVar206 = local_1d8 * fVar226 + fVar198 * fVar235 + fVar197 * fVar218 + fVar102 * fVar175;
      fVar208 = local_1d8 * fVar236 + fVar198 * fVar272 + fVar197 * fVar220 + fVar102 * fVar203;
      fVar242 = local_238 * fVar223 + fVar199 * fVar227 + local_338 * fVar205 + local_348 * fVar161;
      fVar250 = local_238 * fVar225 + fVar199 * fVar234 + local_338 * fVar210 + local_348 * fVar173;
      fVar258 = local_238 * fVar226 + fVar199 * fVar235 + local_338 * fVar218 + local_348 * fVar175;
      fVar260 = local_238 * fVar236 + fVar199 * fVar272 + local_338 * fVar220 + local_348 * fVar203;
      fVar285 = fStack_29c * fVar223 +
                fStack_2ac * fVar227 + fStack_2bc * fVar205 + fStack_28c * fVar161;
      fVar287 = fStack_29c * fVar225 +
                fStack_2ac * fVar234 + fStack_2bc * fVar210 + fStack_28c * fVar173;
      fVar289 = fStack_29c * fVar226 +
                fStack_2ac * fVar235 + fStack_2bc * fVar218 + fStack_28c * fVar175;
      fVar291 = fStack_29c * fVar236 +
                fStack_2ac * fVar272 + fStack_2bc * fVar220 + fStack_28c * fVar203;
      fVar280 = fVar279 - local_398;
      fVar204 = fVar281 - fStack_394;
      fVar207 = fVar206 - fStack_390;
      fVar209 = fVar208 - fStack_38c;
      fVar245 = fVar242 - local_248;
      fVar257 = fVar250 - fStack_244;
      fVar259 = fVar258 - fStack_240;
      fVar269 = fVar260 - fStack_23c;
      fVar144 = local_248 * fVar280 - local_398 * fVar245;
      fVar270 = fStack_244 * fVar204 - fStack_394 * fVar257;
      fVar271 = fStack_240 * fVar207 - fStack_390 * fVar259;
      fVar273 = fStack_23c * fVar209 - fStack_38c * fVar269;
      auVar23._4_4_ = fVar287;
      auVar23._0_4_ = fVar285;
      auVar23._8_4_ = fVar289;
      auVar23._12_4_ = fVar291;
      auVar72 = maxps(auVar266,auVar23);
      bVar60 = fVar144 * fVar144 <=
               auVar72._0_4_ * auVar72._0_4_ * (fVar280 * fVar280 + fVar245 * fVar245) &&
               0.0 < fVar70;
      local_388._0_4_ = -(uint)bVar60;
      bVar46 = fVar270 * fVar270 <=
               auVar72._4_4_ * auVar72._4_4_ * (fVar204 * fVar204 + fVar257 * fVar257) &&
               1.0 < fVar70;
      local_388._4_4_ = -(uint)bVar46;
      bVar47 = fVar271 * fVar271 <=
               auVar72._8_4_ * auVar72._8_4_ * (fVar207 * fVar207 + fVar259 * fVar259) &&
               2.0 < fVar70;
      fStack_380 = (float)-(uint)bVar47;
      bVar48 = fVar273 * fVar273 <=
               auVar72._12_4_ * auVar72._12_4_ * (fVar209 * fVar209 + fVar269 * fVar269) &&
               3.0 < fVar70;
      fStack_37c = (float)-(uint)bVar48;
      local_418 = (float)uVar104;
      local_418 = local_418 * 4.7683716e-07;
      iVar50 = movmskps(iVar18,_local_388);
      fVar144 = *(float *)(ray + k * 4 + 0x30);
      _local_288 = ZEXT416((uint)fVar144);
      fStack_374 = local_378;
      fStack_370 = local_378;
      fStack_36c = local_378;
      fStack_364 = local_368;
      fStack_360 = local_368;
      fStack_35c = local_368;
      fStack_354 = local_358;
      fStack_350 = local_358;
      fStack_34c = local_358;
      fStack_344 = local_348;
      fStack_340 = local_348;
      fStack_33c = local_348;
      fStack_334 = local_338;
      fStack_330 = local_338;
      fStack_32c = local_338;
      fStack_234 = local_238;
      fStack_230 = local_238;
      fStack_22c = local_238;
      local_228 = fStack_2bc;
      fStack_224 = fStack_2bc;
      fStack_220 = fStack_2bc;
      fStack_21c = fStack_2bc;
      local_208 = fStack_29c;
      fStack_204 = fStack_29c;
      fStack_200 = fStack_29c;
      fStack_1fc = fStack_29c;
      local_1f8 = fStack_2ac;
      fStack_1f4 = fStack_2ac;
      fStack_1f0 = fStack_2ac;
      fStack_1ec = fStack_2ac;
      local_1e8 = fStack_28c;
      fStack_1e4 = fStack_28c;
      fStack_1e0 = fStack_28c;
      fStack_1dc = fStack_28c;
      fStack_1d4 = local_1d8;
      fStack_1d0 = local_1d8;
      fStack_1cc = local_1d8;
      if (iVar50 == 0) {
        bVar60 = false;
      }
      else {
        fVar136 = fVar161 * local_378 + fVar205 * local_368 + fVar227 * local_358 +
                  fVar223 * fVar162;
        fVar143 = fVar173 * local_378 + fVar210 * local_368 + fVar234 * local_358 +
                  fVar225 * fVar162;
        fVar145 = fVar175 * local_378 + fVar218 * local_368 + fVar235 * local_358 +
                  fVar226 * fVar162;
        fVar146 = fVar203 * local_378 + fVar220 * local_368 + fVar272 * local_358 +
                  fVar236 * fVar162;
        local_258._0_4_ = auVar25._0_4_;
        local_258._4_4_ = auVar25._4_4_;
        fStack_250 = auVar25._8_4_;
        fVar71 = fVar135 * local_378 + fVar100 * local_368 + local_3a8 * local_358 +
                 (float)local_258._0_4_ * fVar162;
        fVar101 = fVar142 * local_378 + fVar106 * local_368 + fStack_3a4 * local_358 +
                  (float)local_258._4_4_ * fVar162;
        fVar103 = fVar147 * local_378 + fVar130 * local_368 + fStack_3a0 * local_358 +
                  fStack_250 * fVar162;
        fVar105 = fVar160 * local_378 + fVar132 * local_368 + fStack_39c * local_358 +
                  fVar174 * fVar162;
        fVar100 = *(float *)(bspline_basis0 + lVar22 + 0x1210);
        fVar106 = *(float *)(bspline_basis0 + lVar22 + 0x1214);
        fVar130 = *(float *)(bspline_basis0 + lVar22 + 0x1218);
        fVar132 = *(float *)(bspline_basis0 + lVar22 + 0x121c);
        fVar135 = *(float *)(bspline_basis0 + lVar22 + 0x1694);
        fVar142 = *(float *)(bspline_basis0 + lVar22 + 0x1698);
        fVar147 = *(float *)(bspline_basis0 + lVar22 + 0x169c);
        fVar160 = *(float *)(bspline_basis0 + lVar22 + 0x16a0);
        fVar161 = *(float *)(bspline_basis0 + lVar22 + 0x1b18);
        fVar173 = *(float *)(bspline_basis0 + lVar22 + 0x1b1c);
        fVar174 = *(float *)(bspline_basis0 + lVar22 + 0x1b20);
        fVar175 = *(float *)(bspline_basis0 + lVar22 + 0x1b24);
        fVar203 = *(float *)(bspline_basis0 + lVar22 + 0x1f9c);
        fVar205 = *(float *)(bspline_basis0 + lVar22 + 0x1fa0);
        fVar210 = *(float *)(bspline_basis0 + lVar22 + 0x1fa4);
        fVar218 = *(float *)(bspline_basis0 + lVar22 + 0x1fa8);
        fVar237 = local_1d8 * fVar100 + fVar198 * fVar135 + fVar197 * fVar161 + fVar102 * fVar203;
        fVar243 = local_1d8 * fVar106 + fVar198 * fVar142 + fVar197 * fVar173 + fVar102 * fVar205;
        fVar246 = local_1d8 * fVar130 + fVar198 * fVar147 + fVar197 * fVar174 + fVar102 * fVar210;
        fVar248 = local_1d8 * fVar132 + fVar198 * fVar160 + fVar197 * fVar175 + fVar102 * fVar218;
        fVar286 = local_238 * fVar100 +
                  fVar199 * fVar135 + local_338 * fVar161 + local_348 * fVar203;
        fVar288 = local_238 * fVar106 +
                  fVar199 * fVar142 + local_338 * fVar173 + local_348 * fVar205;
        fVar290 = local_238 * fVar130 +
                  fVar199 * fVar147 + local_338 * fVar174 + local_348 * fVar210;
        fVar292 = local_238 * fVar132 +
                  fVar199 * fVar160 + local_338 * fVar175 + local_348 * fVar218;
        fVar220 = *(float *)(bspline_basis1 + lVar22 + 0x1210);
        fVar227 = *(float *)(bspline_basis1 + lVar22 + 0x1214);
        fVar234 = *(float *)(bspline_basis1 + lVar22 + 0x1218);
        fVar235 = *(float *)(bspline_basis1 + lVar22 + 0x121c);
        fVar272 = *(float *)(bspline_basis1 + lVar22 + 0x1b18);
        fVar223 = *(float *)(bspline_basis1 + lVar22 + 0x1b1c);
        fVar225 = *(float *)(bspline_basis1 + lVar22 + 0x1b20);
        fVar226 = *(float *)(bspline_basis1 + lVar22 + 0x1b24);
        fVar236 = *(float *)(bspline_basis1 + lVar22 + 0x1f9c);
        fVar270 = *(float *)(bspline_basis1 + lVar22 + 0x1fa0);
        fVar271 = *(float *)(bspline_basis1 + lVar22 + 0x1fa4);
        fVar273 = *(float *)(bspline_basis1 + lVar22 + 0x1fa8);
        fVar244 = *(float *)(bspline_basis1 + lVar22 + 0x1694);
        fVar247 = *(float *)(bspline_basis1 + lVar22 + 0x1698);
        fVar249 = *(float *)(bspline_basis1 + lVar22 + 0x169c);
        fVar274 = *(float *)(bspline_basis1 + lVar22 + 0x16a0);
        auVar164._0_4_ = fVar198 * fVar244 + fVar197 * fVar272 + fVar102 * fVar236;
        auVar164._4_4_ = fVar198 * fVar247 + fVar197 * fVar223 + fVar102 * fVar270;
        auVar164._8_4_ = fVar198 * fVar249 + fVar197 * fVar225 + fVar102 * fVar271;
        auVar164._12_4_ = fVar198 * fVar274 + fVar197 * fVar226 + fVar102 * fVar273;
        fVar211 = local_1d8 * fVar220 + auVar164._0_4_;
        fVar219 = local_1d8 * fVar227 + auVar164._4_4_;
        fVar221 = local_1d8 * fVar234 + auVar164._8_4_;
        fVar222 = local_1d8 * fVar235 + auVar164._12_4_;
        fVar107 = local_238 * fVar220 +
                  fVar199 * fVar244 + local_338 * fVar272 + local_348 * fVar236;
        fVar131 = local_238 * fVar227 +
                  fVar199 * fVar247 + local_338 * fVar223 + local_348 * fVar270;
        fVar133 = local_238 * fVar234 +
                  fVar199 * fVar249 + local_338 * fVar225 + local_348 * fVar271;
        fVar134 = local_238 * fVar235 +
                  fVar199 * fVar274 + local_338 * fVar226 + local_348 * fVar273;
        auVar267._0_8_ = CONCAT44(fVar243,fVar237) & 0x7fffffff7fffffff;
        auVar267._8_4_ = ABS(fVar246);
        auVar267._12_4_ = ABS(fVar248);
        auVar224._0_8_ = CONCAT44(fVar288,fVar286) & 0x7fffffff7fffffff;
        auVar224._8_4_ = ABS(fVar290);
        auVar224._12_4_ = ABS(fVar292);
        auVar72 = maxps(auVar267,auVar224);
        auVar275._0_8_ =
             CONCAT44(fVar106 * fVar162 +
                      fVar142 * local_358 + fVar173 * local_368 + fVar205 * local_378,
                      fVar100 * fVar162 +
                      fVar135 * local_358 + fVar161 * local_368 + fVar203 * local_378) &
             0x7fffffff7fffffff;
        auVar275._8_4_ =
             ABS(fVar130 * fVar162 + fVar147 * local_358 + fVar174 * local_368 + fVar210 * local_378
                );
        auVar275._12_4_ =
             ABS(fVar132 * fVar162 + fVar160 * local_358 + fVar175 * local_368 + fVar218 * local_378
                );
        auVar72 = maxps(auVar72,auVar275);
        uVar64 = -(uint)(local_418 <= auVar72._0_4_);
        uVar65 = -(uint)(local_418 <= auVar72._4_4_);
        uVar66 = -(uint)(local_418 <= auVar72._8_4_);
        uVar67 = -(uint)(local_418 <= auVar72._12_4_);
        fVar161 = (float)((uint)fVar237 & uVar64 | ~uVar64 & (uint)fVar280);
        fVar173 = (float)((uint)fVar243 & uVar65 | ~uVar65 & (uint)fVar204);
        fVar174 = (float)((uint)fVar246 & uVar66 | ~uVar66 & (uint)fVar207);
        fVar175 = (float)((uint)fVar248 & uVar67 | ~uVar67 & (uint)fVar209);
        fVar218 = (float)(~uVar64 & (uint)fVar245 | (uint)fVar286 & uVar64);
        fVar237 = (float)(~uVar65 & (uint)fVar257 | (uint)fVar288 & uVar65);
        fVar243 = (float)(~uVar66 & (uint)fVar259 | (uint)fVar290 & uVar66);
        fVar246 = (float)(~uVar67 & (uint)fVar269 | (uint)fVar292 & uVar67);
        auVar276._0_8_ = CONCAT44(fVar219,fVar211) & 0x7fffffff7fffffff;
        auVar276._8_4_ = ABS(fVar221);
        auVar276._12_4_ = ABS(fVar222);
        auVar233._0_8_ = CONCAT44(fVar131,fVar107) & 0x7fffffff7fffffff;
        auVar233._8_4_ = ABS(fVar133);
        auVar233._12_4_ = ABS(fVar134);
        auVar72 = maxps(auVar276,auVar233);
        auVar201._0_8_ =
             CONCAT44(fVar227 * fVar162 +
                      fVar247 * local_358 + fVar223 * local_368 + fVar270 * local_378,
                      fVar220 * fVar162 +
                      fVar244 * local_358 + fVar272 * local_368 + fVar236 * local_378) &
             0x7fffffff7fffffff;
        auVar201._8_4_ =
             ABS(fVar234 * fVar162 + fVar249 * local_358 + fVar225 * local_368 + fVar271 * local_378
                );
        auVar201._12_4_ =
             ABS(fVar235 * fVar162 + fVar274 * local_358 + fVar226 * local_368 + fVar273 * local_378
                );
        auVar72 = maxps(auVar72,auVar201);
        uVar64 = -(uint)(local_418 <= auVar72._0_4_);
        uVar65 = -(uint)(local_418 <= auVar72._4_4_);
        uVar66 = -(uint)(local_418 <= auVar72._8_4_);
        uVar67 = -(uint)(local_418 <= auVar72._12_4_);
        fVar135 = (float)((uint)fVar211 & uVar64 | ~uVar64 & (uint)fVar280);
        fVar142 = (float)((uint)fVar219 & uVar65 | ~uVar65 & (uint)fVar204);
        fVar147 = (float)((uint)fVar221 & uVar66 | ~uVar66 & (uint)fVar207);
        fVar160 = (float)((uint)fVar222 & uVar67 | ~uVar67 & (uint)fVar209);
        fVar227 = (float)(~uVar64 & (uint)fVar245 | (uint)fVar107 & uVar64);
        fVar234 = (float)(~uVar65 & (uint)fVar257 | (uint)fVar131 & uVar65);
        fVar235 = (float)(~uVar66 & (uint)fVar259 | (uint)fVar133 & uVar66);
        fVar272 = (float)(~uVar67 & (uint)fVar269 | (uint)fVar134 & uVar67);
        auVar121._0_4_ = fVar218 * fVar218 + fVar161 * fVar161;
        auVar121._4_4_ = fVar237 * fVar237 + fVar173 * fVar173;
        auVar121._8_4_ = fVar243 * fVar243 + fVar174 * fVar174;
        auVar121._12_4_ = fVar246 * fVar246 + fVar175 * fVar175;
        auVar72 = rsqrtps(auVar164,auVar121);
        fVar100 = auVar72._0_4_;
        fVar106 = auVar72._4_4_;
        fVar130 = auVar72._8_4_;
        fVar132 = auVar72._12_4_;
        auVar165._0_4_ = fVar100 * fVar100 * auVar121._0_4_ * 0.5 * fVar100;
        auVar165._4_4_ = fVar106 * fVar106 * auVar121._4_4_ * 0.5 * fVar106;
        auVar165._8_4_ = fVar130 * fVar130 * auVar121._8_4_ * 0.5 * fVar130;
        auVar165._12_4_ = fVar132 * fVar132 * auVar121._12_4_ * 0.5 * fVar132;
        fVar223 = fVar100 * 1.5 - auVar165._0_4_;
        fVar225 = fVar106 * 1.5 - auVar165._4_4_;
        fVar226 = fVar130 * 1.5 - auVar165._8_4_;
        fVar236 = fVar132 * 1.5 - auVar165._12_4_;
        auVar122._0_4_ = fVar227 * fVar227 + fVar135 * fVar135;
        auVar122._4_4_ = fVar234 * fVar234 + fVar142 * fVar142;
        auVar122._8_4_ = fVar235 * fVar235 + fVar147 * fVar147;
        auVar122._12_4_ = fVar272 * fVar272 + fVar160 * fVar160;
        auVar72 = rsqrtps(auVar165,auVar122);
        fVar100 = auVar72._0_4_;
        fVar106 = auVar72._4_4_;
        fVar130 = auVar72._8_4_;
        fVar132 = auVar72._12_4_;
        fVar203 = fVar100 * 1.5 - fVar100 * fVar100 * auVar122._0_4_ * 0.5 * fVar100;
        fVar205 = fVar106 * 1.5 - fVar106 * fVar106 * auVar122._4_4_ * 0.5 * fVar106;
        fVar210 = fVar130 * 1.5 - fVar130 * fVar130 * auVar122._8_4_ * 0.5 * fVar130;
        fVar220 = fVar132 * 1.5 - fVar132 * fVar132 * auVar122._12_4_ * 0.5 * fVar132;
        fVar280 = fVar218 * fVar223 * auVar266._0_4_;
        fVar107 = fVar237 * fVar225 * auVar266._4_4_;
        fVar131 = fVar243 * fVar226 * auVar266._8_4_;
        fVar133 = fVar246 * fVar236 * auVar266._12_4_;
        fVar161 = -fVar161 * fVar223 * auVar266._0_4_;
        fVar173 = -fVar173 * fVar225 * auVar266._4_4_;
        fVar174 = -fVar174 * fVar226 * auVar266._8_4_;
        fVar175 = -fVar175 * fVar236 * auVar266._12_4_;
        fVar246 = fVar223 * 0.0 * auVar266._0_4_;
        fVar248 = fVar225 * 0.0 * auVar266._4_4_;
        fVar286 = fVar226 * 0.0 * auVar266._8_4_;
        fVar288 = fVar236 * 0.0 * auVar266._12_4_;
        fVar274 = fVar227 * fVar203 * fVar285;
        fVar222 = fVar234 * fVar205 * fVar287;
        fVar237 = fVar235 * fVar210 * fVar289;
        fVar243 = fVar272 * fVar220 * fVar291;
        fVar209 = fVar279 + fVar274;
        fVar244 = fVar281 + fVar222;
        fVar247 = fVar206 + fVar237;
        fVar249 = fVar208 + fVar243;
        fVar234 = -fVar135 * fVar203 * fVar285;
        fVar235 = -fVar142 * fVar205 * fVar287;
        fVar204 = -fVar147 * fVar210 * fVar289;
        fVar207 = -fVar160 * fVar220 * fVar291;
        fVar100 = fVar242 + fVar234;
        fVar106 = fVar250 + fVar235;
        fVar130 = fVar258 + fVar204;
        fVar132 = fVar260 + fVar207;
        fVar203 = fVar203 * 0.0 * fVar285;
        fVar205 = fVar205 * 0.0 * fVar287;
        fVar218 = fVar210 * 0.0 * fVar289;
        fVar227 = fVar220 * 0.0 * fVar291;
        fVar135 = local_398 - fVar280;
        fVar142 = fStack_394 - fVar107;
        fVar147 = fStack_390 - fVar131;
        fVar160 = fStack_38c - fVar133;
        fVar134 = fVar136 + fVar203;
        fVar211 = fVar143 + fVar205;
        fVar219 = fVar145 + fVar218;
        fVar221 = fVar146 + fVar227;
        fVar236 = local_248 - fVar161;
        fVar270 = fStack_244 - fVar173;
        fVar271 = fStack_240 - fVar174;
        fVar273 = fStack_23c - fVar175;
        fVar272 = fVar71 - fVar246;
        fVar223 = fVar101 - fVar248;
        fVar225 = fVar103 - fVar286;
        fVar226 = fVar105 - fVar288;
        uVar64 = -(uint)(0.0 < (fVar236 * (fVar134 - fVar272) - fVar272 * (fVar100 - fVar236)) * 0.0
                               + (fVar272 * (fVar209 - fVar135) - (fVar134 - fVar272) * fVar135) *
                                 0.0 + ((fVar100 - fVar236) * fVar135 -
                                       (fVar209 - fVar135) * fVar236));
        uVar65 = -(uint)(0.0 < (fVar270 * (fVar211 - fVar223) - fVar223 * (fVar106 - fVar270)) * 0.0
                               + (fVar223 * (fVar244 - fVar142) - (fVar211 - fVar223) * fVar142) *
                                 0.0 + ((fVar106 - fVar270) * fVar142 -
                                       (fVar244 - fVar142) * fVar270));
        uVar66 = -(uint)(0.0 < (fVar271 * (fVar219 - fVar225) - fVar225 * (fVar130 - fVar271)) * 0.0
                               + (fVar225 * (fVar247 - fVar147) - (fVar219 - fVar225) * fVar147) *
                                 0.0 + ((fVar130 - fVar271) * fVar147 -
                                       (fVar247 - fVar147) * fVar271));
        uVar67 = -(uint)(0.0 < (fVar273 * (fVar221 - fVar226) - fVar226 * (fVar132 - fVar273)) * 0.0
                               + (fVar226 * (fVar249 - fVar160) - (fVar221 - fVar226) * fVar160) *
                                 0.0 + ((fVar132 - fVar273) * fVar160 -
                                       (fVar249 - fVar160) * fVar273));
        fVar274 = (float)((uint)(fVar279 - fVar274) & uVar64 | ~uVar64 & (uint)(local_398 + fVar280)
                         );
        fVar107 = (float)((uint)(fVar281 - fVar222) & uVar65 |
                         ~uVar65 & (uint)(fStack_394 + fVar107));
        fVar131 = (float)((uint)(fVar206 - fVar237) & uVar66 |
                         ~uVar66 & (uint)(fStack_390 + fVar131));
        fVar133 = (float)((uint)(fVar208 - fVar243) & uVar67 |
                         ~uVar67 & (uint)(fStack_38c + fVar133));
        fVar279 = (float)((uint)(fVar242 - fVar234) & uVar64 | ~uVar64 & (uint)(local_248 + fVar161)
                         );
        fVar280 = (float)((uint)(fVar250 - fVar235) & uVar65 |
                         ~uVar65 & (uint)(fStack_244 + fVar173));
        fVar281 = (float)((uint)(fVar258 - fVar204) & uVar66 |
                         ~uVar66 & (uint)(fStack_240 + fVar174));
        fVar204 = (float)((uint)(fVar260 - fVar207) & uVar67 |
                         ~uVar67 & (uint)(fStack_23c + fVar175));
        fVar203 = (float)((uint)(fVar136 - fVar203) & uVar64 | ~uVar64 & (uint)(fVar71 + fVar246));
        fVar210 = (float)((uint)(fVar143 - fVar205) & uVar65 | ~uVar65 & (uint)(fVar101 + fVar248));
        fVar220 = (float)((uint)(fVar145 - fVar218) & uVar66 | ~uVar66 & (uint)(fVar103 + fVar286));
        fVar234 = (float)((uint)(fVar146 - fVar227) & uVar67 | ~uVar67 & (uint)(fVar105 + fVar288));
        fVar161 = (float)((uint)fVar135 & uVar64 | ~uVar64 & (uint)fVar209);
        fVar173 = (float)((uint)fVar142 & uVar65 | ~uVar65 & (uint)fVar244);
        fVar174 = (float)((uint)fVar147 & uVar66 | ~uVar66 & (uint)fVar247);
        fVar175 = (float)((uint)fVar160 & uVar67 | ~uVar67 & (uint)fVar249);
        fVar242 = (float)((uint)fVar236 & uVar64 | ~uVar64 & (uint)fVar100);
        fVar250 = (float)((uint)fVar270 & uVar65 | ~uVar65 & (uint)fVar106);
        fVar258 = (float)((uint)fVar271 & uVar66 | ~uVar66 & (uint)fVar130);
        fVar260 = (float)((uint)fVar273 & uVar67 | ~uVar67 & (uint)fVar132);
        fVar205 = (float)((uint)fVar272 & uVar64 | ~uVar64 & (uint)fVar134);
        fVar218 = (float)((uint)fVar223 & uVar65 | ~uVar65 & (uint)fVar211);
        fVar227 = (float)((uint)fVar225 & uVar66 | ~uVar66 & (uint)fVar219);
        fVar235 = (float)((uint)fVar226 & uVar67 | ~uVar67 & (uint)fVar221);
        fVar206 = (float)((uint)fVar209 & uVar64 | ~uVar64 & (uint)fVar135) - fVar274;
        fVar207 = (float)((uint)fVar244 & uVar65 | ~uVar65 & (uint)fVar142) - fVar107;
        fVar208 = (float)((uint)fVar247 & uVar66 | ~uVar66 & (uint)fVar147) - fVar131;
        fVar209 = (float)((uint)fVar249 & uVar67 | ~uVar67 & (uint)fVar160) - fVar133;
        fVar100 = (float)((uint)fVar100 & uVar64 | ~uVar64 & (uint)fVar236) - fVar279;
        fVar106 = (float)((uint)fVar106 & uVar65 | ~uVar65 & (uint)fVar270) - fVar280;
        fVar130 = (float)((uint)fVar130 & uVar66 | ~uVar66 & (uint)fVar271) - fVar281;
        fVar132 = (float)((uint)fVar132 & uVar67 | ~uVar67 & (uint)fVar273) - fVar204;
        fVar236 = (float)((uint)fVar134 & uVar64 | ~uVar64 & (uint)fVar272) - fVar203;
        fVar270 = (float)((uint)fVar211 & uVar65 | ~uVar65 & (uint)fVar223) - fVar210;
        fVar271 = (float)((uint)fVar219 & uVar66 | ~uVar66 & (uint)fVar225) - fVar220;
        fVar273 = (float)((uint)fVar221 & uVar67 | ~uVar67 & (uint)fVar226) - fVar234;
        fVar101 = fVar274 - fVar161;
        fVar103 = fVar107 - fVar173;
        fVar105 = fVar131 - fVar174;
        fVar134 = fVar133 - fVar175;
        fVar272 = fVar279 - fVar242;
        fVar223 = fVar280 - fVar250;
        fVar225 = fVar281 - fVar258;
        fVar226 = fVar204 - fVar260;
        fVar135 = fVar203 - fVar205;
        fVar142 = fVar210 - fVar218;
        fVar147 = fVar220 - fVar227;
        fVar160 = fVar234 - fVar235;
        fVar244 = (fVar279 * fVar236 - fVar203 * fVar100) * 0.0 +
                  (fVar203 * fVar206 - fVar274 * fVar236) * 0.0 +
                  (fVar274 * fVar100 - fVar279 * fVar206);
        fVar247 = (fVar280 * fVar270 - fVar210 * fVar106) * 0.0 +
                  (fVar210 * fVar207 - fVar107 * fVar270) * 0.0 +
                  (fVar107 * fVar106 - fVar280 * fVar207);
        auVar156._4_4_ = fVar247;
        auVar156._0_4_ = fVar244;
        fVar249 = (fVar281 * fVar271 - fVar220 * fVar130) * 0.0 +
                  (fVar220 * fVar208 - fVar131 * fVar271) * 0.0 +
                  (fVar131 * fVar130 - fVar281 * fVar208);
        fVar71 = (fVar204 * fVar273 - fVar234 * fVar132) * 0.0 +
                 (fVar234 * fVar209 - fVar133 * fVar273) * 0.0 +
                 (fVar133 * fVar132 - fVar204 * fVar209);
        auVar282._0_4_ =
             (fVar242 * fVar135 - fVar205 * fVar272) * 0.0 +
             (fVar205 * fVar101 - fVar161 * fVar135) * 0.0 + (fVar161 * fVar272 - fVar242 * fVar101)
        ;
        auVar282._4_4_ =
             (fVar250 * fVar142 - fVar218 * fVar223) * 0.0 +
             (fVar218 * fVar103 - fVar173 * fVar142) * 0.0 + (fVar173 * fVar223 - fVar250 * fVar103)
        ;
        auVar282._8_4_ =
             (fVar258 * fVar147 - fVar227 * fVar225) * 0.0 +
             (fVar227 * fVar105 - fVar174 * fVar147) * 0.0 + (fVar174 * fVar225 - fVar258 * fVar105)
        ;
        auVar282._12_4_ =
             (fVar260 * fVar160 - fVar235 * fVar226) * 0.0 +
             (fVar235 * fVar134 - fVar175 * fVar160) * 0.0 + (fVar175 * fVar226 - fVar260 * fVar134)
        ;
        auVar156._8_4_ = fVar249;
        auVar156._12_4_ = fVar71;
        auVar72 = maxps(auVar156,auVar282);
        bVar60 = auVar72._0_4_ <= 0.0 && bVar60;
        auVar157._0_4_ = -(uint)bVar60;
        bVar46 = auVar72._4_4_ <= 0.0 && bVar46;
        auVar157._4_4_ = -(uint)bVar46;
        bVar47 = auVar72._8_4_ <= 0.0 && bVar47;
        auVar157._8_4_ = -(uint)bVar47;
        bVar48 = auVar72._12_4_ <= 0.0 && bVar48;
        auVar157._12_4_ = -(uint)bVar48;
        iVar50 = movmskps(iVar50,auVar157);
        if (iVar50 == 0) {
LAB_00b0cd52:
          iVar50 = 0;
          auVar93._8_8_ = uStack_3b0;
          auVar93._0_8_ = local_3b8;
        }
        else {
          auVar166._0_4_ = fVar135 * fVar100;
          auVar166._4_4_ = fVar142 * fVar106;
          auVar166._8_4_ = fVar147 * fVar130;
          auVar166._12_4_ = fVar160 * fVar132;
          fVar173 = fVar272 * fVar236 - auVar166._0_4_;
          fVar174 = fVar223 * fVar270 - auVar166._4_4_;
          fVar175 = fVar225 * fVar271 - auVar166._8_4_;
          fVar205 = fVar226 * fVar273 - auVar166._12_4_;
          fVar135 = fVar135 * fVar206 - fVar236 * fVar101;
          fVar142 = fVar142 * fVar207 - fVar270 * fVar103;
          fVar147 = fVar147 * fVar208 - fVar271 * fVar105;
          fVar160 = fVar160 * fVar209 - fVar273 * fVar134;
          fVar100 = fVar101 * fVar100 - fVar272 * fVar206;
          fVar218 = fVar103 * fVar106 - fVar223 * fVar207;
          fVar227 = fVar105 * fVar130 - fVar225 * fVar208;
          fVar235 = fVar134 * fVar132 - fVar226 * fVar209;
          auVar193._0_4_ = fVar173 * 0.0 + fVar135 * 0.0 + fVar100;
          auVar193._4_4_ = fVar174 * 0.0 + fVar142 * 0.0 + fVar218;
          auVar193._8_4_ = fVar175 * 0.0 + fVar147 * 0.0 + fVar227;
          auVar193._12_4_ = fVar205 * 0.0 + fVar160 * 0.0 + fVar235;
          auVar72 = rcpps(auVar166,auVar193);
          fVar106 = auVar72._0_4_;
          fVar130 = auVar72._4_4_;
          fVar132 = auVar72._8_4_;
          fVar161 = auVar72._12_4_;
          fVar106 = (1.0 - auVar193._0_4_ * fVar106) * fVar106 + fVar106;
          fVar130 = (1.0 - auVar193._4_4_ * fVar130) * fVar130 + fVar130;
          fVar132 = (1.0 - auVar193._8_4_ * fVar132) * fVar132 + fVar132;
          fVar161 = (1.0 - auVar193._12_4_ * fVar161) * fVar161 + fVar161;
          fVar135 = (fVar203 * fVar100 + fVar279 * fVar135 + fVar274 * fVar173) * fVar106;
          fVar142 = (fVar210 * fVar218 + fVar280 * fVar142 + fVar107 * fVar174) * fVar130;
          fVar147 = (fVar220 * fVar227 + fVar281 * fVar147 + fVar131 * fVar175) * fVar132;
          fVar160 = (fVar234 * fVar235 + fVar204 * fVar160 + fVar133 * fVar205) * fVar161;
          fVar100 = *(float *)(ray + k * 4 + 0x80);
          bVar60 = (fVar144 <= fVar135 && fVar135 <= fVar100) && bVar60;
          auVar167._0_4_ = -(uint)bVar60;
          bVar46 = (fVar144 <= fVar142 && fVar142 <= fVar100) && bVar46;
          auVar167._4_4_ = -(uint)bVar46;
          bVar47 = (fVar144 <= fVar147 && fVar147 <= fVar100) && bVar47;
          auVar167._8_4_ = -(uint)bVar47;
          bVar48 = (fVar144 <= fVar160 && fVar160 <= fVar100) && bVar48;
          auVar167._12_4_ = -(uint)bVar48;
          iVar50 = movmskps(iVar50,auVar167);
          if (iVar50 == 0) goto LAB_00b0cd52;
          auVar168._0_8_ =
               CONCAT44(-(uint)(auVar193._4_4_ != 0.0 && bVar46),
                        -(uint)(auVar193._0_4_ != 0.0 && bVar60));
          auVar168._8_4_ = -(uint)(auVar193._8_4_ != 0.0 && bVar47);
          auVar168._12_4_ = -(uint)(auVar193._12_4_ != 0.0 && bVar48);
          iVar50 = movmskps(iVar50,auVar168);
          auVar93._8_8_ = uStack_3b0;
          auVar93._0_8_ = local_3b8;
          if (iVar50 != 0) {
            fVar244 = fVar244 * fVar106;
            fVar247 = fVar247 * fVar130;
            fVar249 = fVar249 * fVar132;
            fVar71 = fVar71 * fVar161;
            local_3e8 = (float)((uint)(1.0 - fVar244) & uVar64 | ~uVar64 & (uint)fVar244);
            fStack_3e4 = (float)((uint)(1.0 - fVar247) & uVar65 | ~uVar65 & (uint)fVar247);
            fStack_3e0 = (float)((uint)(1.0 - fVar249) & uVar66 | ~uVar66 & (uint)fVar249);
            fStack_3dc = (float)((uint)(1.0 - fVar71) & uVar67 | ~uVar67 & (uint)fVar71);
            local_268 = (float)(~uVar64 & (uint)(auVar282._0_4_ * fVar106) |
                               (uint)(1.0 - auVar282._0_4_ * fVar106) & uVar64);
            fStack_264 = (float)(~uVar65 & (uint)(auVar282._4_4_ * fVar130) |
                                (uint)(1.0 - auVar282._4_4_ * fVar130) & uVar65);
            fStack_260 = (float)(~uVar66 & (uint)(auVar282._8_4_ * fVar132) |
                                (uint)(1.0 - auVar282._8_4_ * fVar132) & uVar66);
            fStack_25c = (float)(~uVar67 & (uint)(auVar282._12_4_ * fVar161) |
                                (uint)(1.0 - auVar282._12_4_ * fVar161) & uVar67);
            auVar93._8_4_ = auVar168._8_4_;
            auVar93._0_8_ = auVar168._0_8_;
            auVar93._12_4_ = auVar168._12_4_;
            local_3f8 = fVar135;
            fStack_3f4 = fVar142;
            fStack_3f0 = fVar147;
            fStack_3ec = fVar160;
          }
        }
        iVar50 = movmskps(iVar50,auVar93);
        local_3a8 = fVar245;
        fStack_3a4 = fVar257;
        fStack_3a0 = fVar259;
        fStack_39c = fVar269;
        if (iVar50 == 0) {
          bVar60 = false;
        }
        else {
          fVar100 = (fVar285 - auVar266._0_4_) * local_3e8 + auVar266._0_4_;
          fVar106 = (fVar287 - auVar266._4_4_) * fStack_3e4 + auVar266._4_4_;
          fVar130 = (fVar289 - auVar266._8_4_) * fStack_3e0 + auVar266._8_4_;
          fVar132 = (fVar291 - auVar266._12_4_) * fStack_3dc + auVar266._12_4_;
          fVar144 = *(float *)((long)local_320->ray_space + k * 4 + -0x10);
          auVar123._0_4_ = -(uint)(fVar144 * (fVar100 + fVar100) < local_3f8) & auVar93._0_4_;
          auVar123._4_4_ = -(uint)(fVar144 * (fVar106 + fVar106) < fStack_3f4) & auVar93._4_4_;
          auVar123._8_4_ = -(uint)(fVar144 * (fVar130 + fVar130) < fStack_3f0) & auVar93._8_4_;
          auVar123._12_4_ = -(uint)(fVar144 * (fVar132 + fVar132) < fStack_3ec) & auVar93._12_4_;
          uVar64 = movmskps((int)local_320,auVar123);
          if (uVar64 != 0) {
            local_268 = local_268 + local_268 + -1.0;
            fStack_264 = fStack_264 + fStack_264 + -1.0;
            fStack_260 = fStack_260 + fStack_260 + -1.0;
            fStack_25c = fStack_25c + fStack_25c + -1.0;
            local_198 = 0;
            local_188 = CONCAT44(fStack_2a4,local_2a8);
            uStack_180 = CONCAT44(fStack_29c,fStack_2a0);
            local_178 = CONCAT44(fStack_2b4,local_2b8);
            uStack_170 = CONCAT44(fStack_2ac,fStack_2b0);
            local_168 = CONCAT44(fStack_2c4,local_2c8);
            uStack_160 = CONCAT44(fStack_2bc,fStack_2c0);
            local_158 = CONCAT44(fStack_294,local_298);
            uStack_150 = CONCAT44(fStack_28c,fStack_290);
            pRVar55 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
            local_1c8 = local_3e8;
            fStack_1c4 = fStack_3e4;
            fStack_1c0 = fStack_3e0;
            fStack_1bc = fStack_3dc;
            local_1b8 = local_268;
            fStack_1b4 = fStack_264;
            fStack_1b0 = fStack_260;
            fStack_1ac = fStack_25c;
            local_1a8 = local_3f8;
            fStack_1a4 = fStack_3f4;
            fStack_1a0 = fStack_3f0;
            fStack_19c = fStack_3ec;
            local_194 = iVar18;
            local_148 = auVar123;
            if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              pRVar55 = context->args;
              if ((pRVar55->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar60 = true, pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar70 = 1.0 / fVar70;
                local_138[0] = fVar70 * (local_3e8 + 0.0);
                local_138[1] = fVar70 * (fStack_3e4 + 1.0);
                local_138[2] = fVar70 * (fStack_3e0 + 2.0);
                local_138[3] = fVar70 * (fStack_3dc + 3.0);
                local_128 = CONCAT44(fStack_264,local_268);
                uStack_120 = CONCAT44(fStack_25c,fStack_260);
                local_118[0] = local_3f8;
                local_118[1] = fStack_3f4;
                local_118[2] = fStack_3f0;
                local_118[3] = fStack_3ec;
                pGVar58 = (Geometry *)(ulong)(uVar64 & 0xff);
                uVar59 = 0;
                if (pGVar58 != (Geometry *)0x0) {
                  for (; ((uVar64 & 0xff) >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                  }
                }
                local_488 = CONCAT44((undefined4)local_3c0,(undefined4)local_3c0);
                uStack_480._0_4_ = (undefined4)local_3c0;
                uStack_480._4_4_ = (undefined4)local_3c0;
                local_438 = CONCAT44((undefined4)local_2d8,(undefined4)local_2d8);
                uStack_430._0_4_ = (undefined4)local_2d8;
                uStack_430._4_4_ = (undefined4)local_2d8;
                auVar72 = *local_328;
                uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
                do {
                  local_d8 = local_138[uVar59];
                  local_c8 = *(undefined4 *)((long)&local_128 + uVar59 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_118[uVar59];
                  fVar106 = 1.0 - local_d8;
                  fVar144 = local_d8 * fVar106 * 4.0;
                  fVar130 = (fVar106 * fVar106 + fVar144) * 0.5;
                  fVar100 = local_d8 * local_d8 * 0.5;
                  fVar70 = (-local_d8 * local_d8 - fVar144) * 0.5;
                  local_318.context = context->user;
                  fVar144 = -fVar106 * fVar106 * 0.5;
                  local_108 = fVar144 * local_2a8 +
                              fVar70 * local_2b8 + fVar130 * local_2c8 + fVar100 * local_298;
                  local_f8 = fVar144 * fStack_2a4 +
                             fVar70 * fStack_2b4 + fVar130 * fStack_2c4 + fVar100 * fStack_294;
                  local_e8 = fVar144 * fStack_2a0 +
                             fVar70 * fStack_2b0 + fVar130 * fStack_2c0 + fVar100 * fStack_290;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  uStack_c4 = local_c8;
                  uStack_c0 = local_c8;
                  uStack_bc = local_c8;
                  local_b8 = local_438;
                  uStack_b0 = uStack_430;
                  local_a8 = local_488;
                  uStack_a0 = uStack_480;
                  local_98 = (local_318.context)->instID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_88 = (local_318.context)->instPrimID[0];
                  uStack_84 = local_88;
                  uStack_80 = local_88;
                  uStack_7c = local_88;
                  local_318.valid = (int *)local_3d8;
                  pRVar55 = (RTCIntersectArguments *)pGVar19->userPtr;
                  local_318.hit = (RTCHitN *)&local_108;
                  local_318.N = 4;
                  p_Var52 = pGVar19->occlusionFilterN;
                  local_3d8 = auVar72;
                  local_318.geometryUserPtr = pRVar55;
                  local_318.ray = (RTCRayN *)ray;
                  if (p_Var52 != (RTCFilterFunctionN)0x0) {
                    p_Var52 = (RTCFilterFunctionN)(*p_Var52)(&local_318);
                  }
                  auVar124._0_4_ = -(uint)(local_3d8._0_4_ == 0);
                  auVar124._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                  auVar124._8_4_ = -(uint)(local_3d8._8_4_ == 0);
                  auVar124._12_4_ = -(uint)(local_3d8._12_4_ == 0);
                  uVar64 = movmskps((int)p_Var52,auVar124);
                  pRVar53 = (RTCRayN *)(ulong)(uVar64 ^ 0xf);
                  if ((uVar64 ^ 0xf) == 0) {
                    auVar124 = auVar124 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar55 = context->args;
                    if ((pRVar55->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar55->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar55->filter)(&local_318);
                    }
                    auVar94._0_4_ = -(uint)(local_3d8._0_4_ == 0);
                    auVar94._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                    auVar94._8_4_ = -(uint)(local_3d8._8_4_ == 0);
                    auVar94._12_4_ = -(uint)(local_3d8._12_4_ == 0);
                    auVar124 = auVar94 ^ _DAT_01f7ae20;
                    *(undefined1 (*) [16])(local_318.ray + 0x80) =
                         ~auVar94 & _DAT_01f7aa00 |
                         *(undefined1 (*) [16])(local_318.ray + 0x80) & auVar94;
                    pRVar53 = local_318.ray;
                  }
                  auVar125._0_4_ = auVar124._0_4_ << 0x1f;
                  auVar125._4_4_ = auVar124._4_4_ << 0x1f;
                  auVar125._8_4_ = auVar124._8_4_ << 0x1f;
                  auVar125._12_4_ = auVar124._12_4_ << 0x1f;
                  iVar50 = movmskps((int)pRVar53,auVar125);
                  if (iVar50 != 0) {
                    bVar60 = true;
                    break;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar54;
                  pGVar58 = (Geometry *)((ulong)pGVar58 ^ 1L << (uVar59 & 0x3f));
                  uVar59 = 0;
                  if (pGVar58 != (Geometry *)0x0) {
                    for (; ((ulong)pGVar58 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                    }
                  }
                  bVar60 = false;
                } while (pGVar58 != (Geometry *)0x0);
              }
              goto LAB_00b0bdd9;
            }
          }
          bVar60 = false;
        }
      }
LAB_00b0bdd9:
      uVar54 = SUB84(pRVar55,0);
      if (4 < iVar18) {
        local_58 = iVar18;
        iStack_54 = iVar18;
        iStack_50 = iVar18;
        iStack_4c = iVar18;
        local_288._4_4_ = local_288._0_4_;
        fStack_280 = (float)local_288._0_4_;
        fStack_27c = (float)local_288._0_4_;
        local_78 = 1.0 / (float)local_2e8._0_4_;
        fStack_74 = local_78;
        fStack_70 = local_78;
        fStack_6c = local_78;
        local_2e8._4_4_ = (undefined4)local_3c0;
        local_2e8._0_4_ = (undefined4)local_3c0;
        local_2e8._8_4_ = (undefined4)local_3c0;
        local_2e8._12_4_ = (undefined4)local_3c0;
        local_68 = (undefined4)local_2d8;
        uStack_64 = (undefined4)local_2d8;
        uStack_60 = (undefined4)local_2d8;
        uStack_5c = (undefined4)local_2d8;
        lVar62 = 4;
        do {
          uVar65 = (uint)lVar62;
          puVar56 = bspline_basis0 + lVar22;
          pfVar1 = (float *)(puVar56 + lVar62 * 4);
          fVar144 = *pfVar1;
          fVar70 = pfVar1[1];
          fVar100 = pfVar1[2];
          fVar106 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x21aefac + lVar62 * 4);
          fVar130 = *pfVar1;
          fVar132 = pfVar1[1];
          fVar135 = pfVar1[2];
          fVar142 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x21af430 + lVar62 * 4);
          local_3a8 = *pfVar1;
          fStack_3a4 = pfVar1[1];
          fStack_3a0 = pfVar1[2];
          fStack_39c = pfVar1[3];
          pauVar7 = (undefined1 (*) [16])(lVar22 + 0x21af8b4 + lVar62 * 4);
          fVar147 = *(float *)*pauVar7;
          fVar160 = *(float *)(*pauVar7 + 4);
          fVar161 = *(float *)(*pauVar7 + 8);
          auVar25 = *(undefined1 (*) [12])*pauVar7;
          fVar173 = *(float *)(*pauVar7 + 0xc);
          _local_388 = *pauVar7;
          fVar273 = local_1d8 * fVar144 +
                    fVar198 * fVar130 + fVar197 * local_3a8 + fVar102 * fVar147;
          fVar279 = fStack_1d4 * fVar70 +
                    fVar198 * fVar132 + fVar197 * fStack_3a4 + fVar102 * fVar160;
          fVar280 = fStack_1d0 * fVar100 +
                    fVar198 * fVar135 + fVar197 * fStack_3a0 + fVar102 * fVar161;
          fVar281 = fStack_1cc * fVar106 +
                    fVar198 * fVar142 + fVar197 * fStack_39c + fVar102 * fVar173;
          local_248 = local_238 * fVar144 +
                      fVar199 * fVar130 + local_338 * local_3a8 + local_348 * fVar147;
          fStack_244 = fStack_234 * fVar70 +
                       fVar199 * fVar132 + fStack_334 * fStack_3a4 + fStack_344 * fVar160;
          fStack_240 = fStack_230 * fVar100 +
                       fVar199 * fVar135 + fStack_330 * fStack_3a0 + fStack_340 * fVar161;
          fStack_23c = fStack_22c * fVar106 +
                       fVar199 * fVar142 + fStack_32c * fStack_39c + fStack_33c * fVar173;
          auVar127._0_4_ =
               local_208 * fVar144 +
               local_1f8 * fVar130 + local_228 * local_3a8 + local_1e8 * fVar147;
          auVar127._4_4_ =
               fStack_204 * fVar70 +
               fStack_1f4 * fVar132 + fStack_224 * fStack_3a4 + fStack_1e4 * fVar160;
          auVar127._8_4_ =
               fStack_200 * fVar100 +
               fStack_1f0 * fVar135 + fStack_220 * fStack_3a0 + fStack_1e0 * fVar161;
          auVar127._12_4_ =
               fStack_1fc * fVar106 +
               fStack_1ec * fVar142 + fStack_21c * fStack_39c + fStack_1dc * fVar173;
          pfVar1 = (float *)(bspline_basis1 + lVar22 + lVar62 * 4);
          fVar147 = *pfVar1;
          fVar160 = pfVar1[1];
          fVar161 = pfVar1[2];
          fVar174 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x21b13cc + lVar62 * 4);
          fVar175 = *pfVar1;
          fVar203 = pfVar1[1];
          fVar205 = pfVar1[2];
          fVar210 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x21b1850 + lVar62 * 4);
          fVar218 = *pfVar1;
          fVar220 = pfVar1[1];
          fVar227 = pfVar1[2];
          fVar234 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x21b1cd4 + lVar62 * 4);
          fVar235 = *pfVar1;
          fVar272 = pfVar1[1];
          fVar223 = pfVar1[2];
          fVar225 = pfVar1[3];
          fVar226 = local_1d8 * fVar147 + fVar198 * fVar175 + fVar197 * fVar218 + fVar102 * fVar235;
          fVar242 = fStack_1d4 * fVar160 + fVar198 * fVar203 + fVar197 * fVar220 + fVar102 * fVar272
          ;
          fVar250 = fStack_1d0 * fVar161 + fVar198 * fVar205 + fVar197 * fVar227 + fVar102 * fVar223
          ;
          fVar258 = fStack_1cc * fVar174 + fVar198 * fVar210 + fVar197 * fVar234 + fVar102 * fVar225
          ;
          fVar260 = local_238 * fVar147 +
                    fVar199 * fVar175 + local_338 * fVar218 + local_348 * fVar235;
          fVar269 = fStack_234 * fVar160 +
                    fVar199 * fVar203 + fStack_334 * fVar220 + fStack_344 * fVar272;
          fVar270 = fStack_230 * fVar161 +
                    fVar199 * fVar205 + fStack_330 * fVar227 + fStack_340 * fVar223;
          fVar271 = fStack_22c * fVar174 +
                    fVar199 * fVar210 + fStack_32c * fVar234 + fStack_33c * fVar225;
          auVar283._0_4_ =
               local_208 * fVar147 + local_1f8 * fVar175 + local_228 * fVar218 + local_1e8 * fVar235
          ;
          auVar283._4_4_ =
               fStack_204 * fVar160 +
               fStack_1f4 * fVar203 + fStack_224 * fVar220 + fStack_1e4 * fVar272;
          auVar283._8_4_ =
               fStack_200 * fVar161 +
               fStack_1f0 * fVar205 + fStack_220 * fVar227 + fStack_1e0 * fVar223;
          auVar283._12_4_ =
               fStack_1fc * fVar174 +
               fStack_1ec * fVar210 + fStack_21c * fVar234 + fStack_1dc * fVar225;
          fVar236 = fVar226 - fVar273;
          fVar245 = fVar242 - fVar279;
          fVar257 = fVar250 - fVar280;
          fVar259 = fVar258 - fVar281;
          local_398 = fVar260 - local_248;
          fStack_394 = fVar269 - fStack_244;
          fStack_390 = fVar270 - fStack_240;
          fStack_38c = fVar271 - fStack_23c;
          fVar204 = local_248 * fVar236 - fVar273 * local_398;
          fVar206 = fStack_244 * fVar245 - fVar279 * fStack_394;
          fVar207 = fStack_240 * fVar257 - fVar280 * fStack_390;
          fVar208 = fStack_23c * fVar259 - fVar281 * fStack_38c;
          auVar72 = maxps(auVar127,auVar283);
          bVar46 = fVar204 * fVar204 <=
                   auVar72._0_4_ * auVar72._0_4_ * (fVar236 * fVar236 + local_398 * local_398) &&
                   (int)uVar65 < local_58;
          auVar217._0_4_ = -(uint)bVar46;
          bVar47 = fVar206 * fVar206 <=
                   auVar72._4_4_ * auVar72._4_4_ * (fVar245 * fVar245 + fStack_394 * fStack_394) &&
                   (int)(uVar65 | 1) < iStack_54;
          auVar217._4_4_ = -(uint)bVar47;
          bVar48 = fVar207 * fVar207 <=
                   auVar72._8_4_ * auVar72._8_4_ * (fVar257 * fVar257 + fStack_390 * fStack_390) &&
                   (int)(uVar65 | 2) < iStack_50;
          auVar217._8_4_ = -(uint)bVar48;
          bVar49 = fVar208 * fVar208 <=
                   auVar72._12_4_ * auVar72._12_4_ * (fVar259 * fVar259 + fStack_38c * fStack_38c)
                   && (int)(uVar65 | 3) < iStack_4c;
          auVar217._12_4_ = -(uint)bVar49;
          uVar64 = movmskps((int)pGVar58,auVar217);
          pGVar58 = (Geometry *)(ulong)uVar64;
          if (uVar64 != 0) {
            local_2d8 = CONCAT44(fVar245,fVar236);
            fVar289 = fVar235 * local_378 + fVar218 * local_368 + fVar175 * local_358 +
                      fVar147 * fVar162;
            fVar291 = fVar272 * fStack_374 + fVar220 * fStack_364 + fVar203 * fStack_354 +
                      fVar160 * fVar162;
            fVar244 = fVar223 * fStack_370 + fVar227 * fStack_360 + fVar205 * fStack_350 +
                      fVar161 * fVar162;
            fVar247 = fVar225 * fStack_36c + fVar234 * fStack_35c + fVar210 * fStack_34c +
                      fVar174 * fVar162;
            local_388._0_4_ = auVar25._0_4_;
            local_388._4_4_ = auVar25._4_4_;
            fStack_380 = auVar25._8_4_;
            fVar103 = (float)local_388._0_4_ * local_378 + local_3a8 * local_368 +
                      fVar130 * local_358 + fVar144 * fVar162;
            fVar105 = (float)local_388._4_4_ * fStack_374 + fStack_3a4 * fStack_364 +
                      fVar132 * fStack_354 + fVar70 * fVar162;
            fVar107 = fStack_380 * fStack_370 + fStack_3a0 * fStack_360 + fVar135 * fStack_350 +
                      fVar100 * fVar162;
            fVar131 = fVar173 * fStack_36c + fStack_39c * fStack_35c + fVar142 * fStack_34c +
                      fVar106 * fVar162;
            pfVar1 = (float *)(lVar22 + 0x21afd38 + lVar62 * 4);
            fVar144 = *pfVar1;
            fVar70 = pfVar1[1];
            fVar100 = pfVar1[2];
            fVar106 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x21b01bc + lVar62 * 4);
            fVar130 = *pfVar1;
            fVar132 = pfVar1[1];
            fVar135 = pfVar1[2];
            fVar142 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x21b0640 + lVar62 * 4);
            fVar147 = *pfVar1;
            fVar160 = pfVar1[1];
            fVar161 = pfVar1[2];
            fVar173 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x21b0ac4 + lVar62 * 4);
            fVar174 = *pfVar1;
            fVar175 = pfVar1[1];
            fVar203 = pfVar1[2];
            fVar205 = pfVar1[3];
            fVar133 = local_1d8 * fVar144 +
                      fVar198 * fVar130 + fVar197 * fVar147 + fVar102 * fVar174;
            fVar134 = fStack_1d4 * fVar70 +
                      fVar198 * fVar132 + fVar197 * fVar160 + fVar102 * fVar175;
            fVar136 = fStack_1d0 * fVar100 +
                      fVar198 * fVar135 + fVar197 * fVar161 + fVar102 * fVar203;
            fVar143 = fStack_1cc * fVar106 +
                      fVar198 * fVar142 + fVar197 * fVar173 + fVar102 * fVar205;
            fVar249 = local_238 * fVar144 +
                      fVar199 * fVar130 + local_338 * fVar147 + local_348 * fVar174;
            fVar274 = fStack_234 * fVar70 +
                      fVar199 * fVar132 + fStack_334 * fVar160 + fStack_344 * fVar175;
            fVar71 = fStack_230 * fVar100 +
                     fVar199 * fVar135 + fStack_330 * fVar161 + fStack_340 * fVar203;
            fVar101 = fStack_22c * fVar106 +
                      fVar199 * fVar142 + fStack_32c * fVar173 + fStack_33c * fVar205;
            pfVar1 = (float *)(lVar22 + 0x21b2158 + lVar62 * 4);
            fVar210 = *pfVar1;
            fVar218 = pfVar1[1];
            fVar220 = pfVar1[2];
            fVar227 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x21b2a60 + lVar62 * 4);
            fVar234 = *pfVar1;
            fVar235 = pfVar1[1];
            fVar272 = pfVar1[2];
            fVar223 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x21b2ee4 + lVar62 * 4);
            fVar225 = *pfVar1;
            fVar204 = pfVar1[1];
            fVar206 = pfVar1[2];
            fVar207 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x21b25dc + lVar62 * 4);
            fVar208 = *pfVar1;
            fVar209 = pfVar1[1];
            fVar285 = pfVar1[2];
            fVar287 = pfVar1[3];
            fVar145 = local_1d8 * fVar210 +
                      fVar198 * fVar208 + fVar197 * fVar234 + fVar102 * fVar225;
            fVar146 = fStack_1d4 * fVar218 +
                      fVar198 * fVar209 + fVar197 * fVar235 + fVar102 * fVar204;
            fVar211 = fStack_1d0 * fVar220 +
                      fVar198 * fVar285 + fVar197 * fVar272 + fVar102 * fVar206;
            fVar219 = fStack_1cc * fVar227 +
                      fVar198 * fVar287 + fVar197 * fVar223 + fVar102 * fVar207;
            fVar221 = local_238 * fVar210 +
                      fVar199 * fVar208 + local_338 * fVar234 + local_348 * fVar225;
            fVar222 = fStack_234 * fVar218 +
                      fVar199 * fVar209 + fStack_334 * fVar235 + fStack_344 * fVar204;
            fVar237 = fStack_230 * fVar220 +
                      fVar199 * fVar285 + fStack_330 * fVar272 + fStack_340 * fVar206;
            fVar243 = fStack_22c * fVar227 +
                      fVar199 * fVar287 + fStack_32c * fVar223 + fStack_33c * fVar207;
            auVar268._0_8_ = CONCAT44(fVar134,fVar133) & 0x7fffffff7fffffff;
            auVar268._8_4_ = ABS(fVar136);
            auVar268._12_4_ = ABS(fVar143);
            auVar194._0_8_ = CONCAT44(fVar274,fVar249) & 0x7fffffff7fffffff;
            auVar194._8_4_ = ABS(fVar71);
            auVar194._12_4_ = ABS(fVar101);
            auVar72 = maxps(auVar268,auVar194);
            auVar277._0_8_ =
                 CONCAT44(fVar70 * fVar162 +
                          fVar132 * fStack_354 + fVar160 * fStack_364 + fVar175 * fStack_374,
                          fVar144 * fVar162 +
                          fVar130 * local_358 + fVar147 * local_368 + fVar174 * local_378) &
                 0x7fffffff7fffffff;
            auVar277._8_4_ =
                 ABS(fVar100 * fVar162 +
                     fVar135 * fStack_350 + fVar161 * fStack_360 + fVar203 * fStack_370);
            auVar277._12_4_ =
                 ABS(fVar106 * fVar162 +
                     fVar142 * fStack_34c + fVar173 * fStack_35c + fVar205 * fStack_36c);
            auVar72 = maxps(auVar72,auVar277);
            uVar64 = -(uint)(local_418 <= auVar72._0_4_);
            uVar66 = -(uint)(local_418 <= auVar72._4_4_);
            uVar67 = -(uint)(local_418 <= auVar72._8_4_);
            uVar68 = -(uint)(local_418 <= auVar72._12_4_);
            auVar195._0_4_ = ~uVar64 & (uint)fVar236;
            auVar195._4_4_ = ~uVar66 & (uint)fVar245;
            auVar195._8_4_ = ~uVar67 & (uint)fVar257;
            auVar195._12_4_ = ~uVar68 & (uint)fVar259;
            auVar256._0_4_ = (uint)fVar133 & uVar64;
            auVar256._4_4_ = (uint)fVar134 & uVar66;
            auVar256._8_4_ = (uint)fVar136 & uVar67;
            auVar256._12_4_ = (uint)fVar143 & uVar68;
            auVar256 = auVar256 | auVar195;
            fVar249 = (float)(~uVar64 & (uint)local_398 | (uint)fVar249 & uVar64);
            fVar274 = (float)(~uVar66 & (uint)fStack_394 | (uint)fVar274 & uVar66);
            fVar71 = (float)(~uVar67 & (uint)fStack_390 | (uint)fVar71 & uVar67);
            fVar133 = (float)(~uVar68 & (uint)fStack_38c | (uint)fVar101 & uVar68);
            auVar278._0_8_ = CONCAT44(fVar146,fVar145) & 0x7fffffff7fffffff;
            auVar278._8_4_ = ABS(fVar211);
            auVar278._12_4_ = ABS(fVar219);
            auVar139._0_8_ = CONCAT44(fVar222,fVar221) & 0x7fffffff7fffffff;
            auVar139._8_4_ = ABS(fVar237);
            auVar139._12_4_ = ABS(fVar243);
            auVar72 = maxps(auVar278,auVar139);
            auVar95._0_8_ =
                 CONCAT44(fVar218 * fVar162 +
                          fVar209 * fStack_354 + fVar235 * fStack_364 + fVar204 * fStack_374,
                          fVar210 * fVar162 +
                          fVar208 * local_358 + fVar234 * local_368 + fVar225 * local_378) &
                 0x7fffffff7fffffff;
            auVar95._8_4_ =
                 ABS(fVar220 * fVar162 +
                     fVar285 * fStack_350 + fVar272 * fStack_360 + fVar206 * fStack_370);
            auVar95._12_4_ =
                 ABS(fVar227 * fVar162 +
                     fVar287 * fStack_34c + fVar223 * fStack_35c + fVar207 * fStack_36c);
            auVar72 = maxps(auVar72,auVar95);
            uVar64 = -(uint)(local_418 <= auVar72._0_4_);
            uVar66 = -(uint)(local_418 <= auVar72._4_4_);
            uVar67 = -(uint)(local_418 <= auVar72._8_4_);
            uVar68 = -(uint)(local_418 <= auVar72._12_4_);
            fVar209 = (float)((uint)fVar145 & uVar64 | ~uVar64 & (uint)fVar236);
            fVar285 = (float)((uint)fVar146 & uVar66 | ~uVar66 & (uint)fVar245);
            fVar287 = (float)((uint)fVar211 & uVar67 | ~uVar67 & (uint)fVar257);
            fVar136 = (float)((uint)fVar219 & uVar68 | ~uVar68 & (uint)fVar259);
            fVar234 = (float)(~uVar64 & (uint)local_398 | (uint)fVar221 & uVar64);
            fVar272 = (float)(~uVar66 & (uint)fStack_394 | (uint)fVar222 & uVar66);
            fVar225 = (float)(~uVar67 & (uint)fStack_390 | (uint)fVar237 & uVar67);
            fVar236 = (float)(~uVar68 & (uint)fStack_38c | (uint)fVar243 & uVar68);
            fVar142 = auVar256._0_4_;
            fVar144 = auVar256._4_4_;
            fVar70 = auVar256._8_4_;
            fVar100 = auVar256._12_4_;
            auVar169._0_4_ = fVar249 * fVar249 + fVar142 * fVar142;
            auVar169._4_4_ = fVar274 * fVar274 + fVar144 * fVar144;
            auVar169._8_4_ = fVar71 * fVar71 + fVar70 * fVar70;
            auVar169._12_4_ = fVar133 * fVar133 + fVar100 * fVar100;
            auVar72 = rsqrtps(auVar195,auVar169);
            fVar106 = auVar72._0_4_;
            fVar130 = auVar72._4_4_;
            fVar132 = auVar72._8_4_;
            fVar135 = auVar72._12_4_;
            auVar196._0_4_ = fVar106 * fVar106 * auVar169._0_4_ * 0.5 * fVar106;
            auVar196._4_4_ = fVar130 * fVar130 * auVar169._4_4_ * 0.5 * fVar130;
            auVar196._8_4_ = fVar132 * fVar132 * auVar169._8_4_ * 0.5 * fVar132;
            auVar196._12_4_ = fVar135 * fVar135 * auVar169._12_4_ * 0.5 * fVar135;
            fVar174 = fVar106 * 1.5 - auVar196._0_4_;
            fVar175 = fVar130 * 1.5 - auVar196._4_4_;
            fVar203 = fVar132 * 1.5 - auVar196._8_4_;
            fVar205 = fVar135 * 1.5 - auVar196._12_4_;
            auVar170._0_4_ = fVar234 * fVar234 + fVar209 * fVar209;
            auVar170._4_4_ = fVar272 * fVar272 + fVar285 * fVar285;
            auVar170._8_4_ = fVar225 * fVar225 + fVar287 * fVar287;
            auVar170._12_4_ = fVar236 * fVar236 + fVar136 * fVar136;
            auVar72 = rsqrtps(auVar196,auVar170);
            fVar106 = auVar72._0_4_;
            fVar130 = auVar72._4_4_;
            fVar132 = auVar72._8_4_;
            fVar135 = auVar72._12_4_;
            fVar147 = fVar106 * 1.5 - fVar106 * fVar106 * auVar170._0_4_ * 0.5 * fVar106;
            fVar160 = fVar130 * 1.5 - fVar130 * fVar130 * auVar170._4_4_ * 0.5 * fVar130;
            fVar161 = fVar132 * 1.5 - fVar132 * fVar132 * auVar170._8_4_ * 0.5 * fVar132;
            fVar173 = fVar135 * 1.5 - fVar135 * fVar135 * auVar170._12_4_ * 0.5 * fVar135;
            fVar235 = fVar249 * fVar174 * auVar127._0_4_;
            fVar223 = fVar274 * fVar175 * auVar127._4_4_;
            fVar101 = fVar71 * fVar203 * auVar127._8_4_;
            fVar134 = fVar133 * fVar205 * auVar127._12_4_;
            fVar130 = -fVar142 * fVar174 * auVar127._0_4_;
            fVar132 = -fVar144 * fVar175 * auVar127._4_4_;
            fVar135 = -fVar70 * fVar203 * auVar127._8_4_;
            fVar142 = -fVar100 * fVar205 * auVar127._12_4_;
            fVar210 = fVar174 * 0.0 * auVar127._0_4_;
            fVar218 = fVar175 * 0.0 * auVar127._4_4_;
            fVar220 = fVar203 * 0.0 * auVar127._8_4_;
            fVar227 = fVar205 * 0.0 * auVar127._12_4_;
            local_388._0_4_ = fVar103 + fVar210;
            local_388._4_4_ = fVar105 + fVar218;
            fStack_380 = fVar107 + fVar220;
            fStack_37c = fVar131 + fVar227;
            fVar245 = fVar234 * fVar147 * auVar283._0_4_;
            fVar143 = fVar272 * fVar160 * auVar283._4_4_;
            fVar145 = fVar225 * fVar161 * auVar283._8_4_;
            fVar146 = fVar236 * fVar173 * auVar283._12_4_;
            fVar204 = fVar226 + fVar245;
            fVar206 = fVar242 + fVar143;
            fVar207 = fVar250 + fVar145;
            fVar208 = fVar258 + fVar146;
            fVar144 = -fVar209 * fVar147 * auVar283._0_4_;
            fVar70 = -fVar285 * fVar160 * auVar283._4_4_;
            fVar100 = -fVar287 * fVar161 * auVar283._8_4_;
            fVar106 = -fVar136 * fVar173 * auVar283._12_4_;
            fVar209 = fVar260 + fVar144;
            fVar285 = fVar269 + fVar70;
            fVar287 = fVar270 + fVar100;
            fVar249 = fVar271 + fVar106;
            fVar174 = fVar147 * 0.0 * auVar283._0_4_;
            fVar175 = fVar160 * 0.0 * auVar283._4_4_;
            fVar203 = fVar161 * 0.0 * auVar283._8_4_;
            fVar205 = fVar173 * 0.0 * auVar283._12_4_;
            fVar147 = fVar273 - fVar235;
            fVar160 = fVar279 - fVar223;
            fVar161 = fVar280 - fVar101;
            fVar173 = fVar281 - fVar134;
            fVar274 = fVar289 + fVar174;
            fVar71 = fVar291 + fVar175;
            fVar133 = fVar244 + fVar203;
            fVar136 = fVar247 + fVar205;
            fVar234 = local_248 - fVar130;
            fVar272 = fStack_244 - fVar132;
            fVar225 = fStack_240 - fVar135;
            fVar236 = fStack_23c - fVar142;
            fVar103 = fVar103 - fVar210;
            fVar105 = fVar105 - fVar218;
            fVar107 = fVar107 - fVar220;
            fVar131 = fVar131 - fVar227;
            uVar64 = -(uint)(0.0 < (fVar234 * (fVar274 - fVar103) - fVar103 * (fVar209 - fVar234)) *
                                   0.0 + (fVar103 * (fVar204 - fVar147) -
                                         (fVar274 - fVar103) * fVar147) * 0.0 +
                                         ((fVar209 - fVar234) * fVar147 -
                                         (fVar204 - fVar147) * fVar234));
            uVar66 = -(uint)(0.0 < (fVar272 * (fVar71 - fVar105) - fVar105 * (fVar285 - fVar272)) *
                                   0.0 + (fVar105 * (fVar206 - fVar160) -
                                         (fVar71 - fVar105) * fVar160) * 0.0 +
                                         ((fVar285 - fVar272) * fVar160 -
                                         (fVar206 - fVar160) * fVar272));
            uVar67 = -(uint)(0.0 < (fVar225 * (fVar133 - fVar107) - fVar107 * (fVar287 - fVar225)) *
                                   0.0 + (fVar107 * (fVar207 - fVar161) -
                                         (fVar133 - fVar107) * fVar161) * 0.0 +
                                         ((fVar287 - fVar225) * fVar161 -
                                         (fVar207 - fVar161) * fVar225));
            uVar68 = -(uint)(0.0 < (fVar236 * (fVar136 - fVar131) - fVar131 * (fVar249 - fVar236)) *
                                   0.0 + (fVar131 * (fVar208 - fVar173) -
                                         (fVar136 - fVar131) * fVar173) * 0.0 +
                                         ((fVar249 - fVar236) * fVar173 -
                                         (fVar208 - fVar173) * fVar236));
            fVar245 = (float)((uint)(fVar226 - fVar245) & uVar64 |
                             ~uVar64 & (uint)(fVar273 + fVar235));
            fVar273 = (float)((uint)(fVar242 - fVar143) & uVar66 |
                             ~uVar66 & (uint)(fVar279 + fVar223));
            fVar250 = (float)((uint)(fVar250 - fVar145) & uVar67 |
                             ~uVar67 & (uint)(fVar280 + fVar101));
            fVar258 = (float)((uint)(fVar258 - fVar146) & uVar68 |
                             ~uVar68 & (uint)(fVar281 + fVar134));
            fVar101 = (float)((uint)(fVar260 - fVar144) & uVar64 |
                             ~uVar64 & (uint)(local_248 + fVar130));
            fVar134 = (float)((uint)(fVar269 - fVar70) & uVar66 |
                             ~uVar66 & (uint)(fStack_244 + fVar132));
            fVar143 = (float)((uint)(fVar270 - fVar100) & uVar67 |
                             ~uVar67 & (uint)(fStack_240 + fVar135));
            fVar145 = (float)((uint)(fVar271 - fVar106) & uVar68 |
                             ~uVar68 & (uint)(fStack_23c + fVar142));
            fVar130 = (float)((uint)(fVar289 - fVar174) & uVar64 | ~uVar64 & local_388._0_4_);
            fVar132 = (float)((uint)(fVar291 - fVar175) & uVar66 | ~uVar66 & local_388._4_4_);
            fVar135 = (float)((uint)(fVar244 - fVar203) & uVar67 | ~uVar67 & (uint)fStack_380);
            fVar142 = (float)((uint)(fVar247 - fVar205) & uVar68 | ~uVar68 & (uint)fStack_37c);
            fVar210 = (float)((uint)fVar147 & uVar64 | ~uVar64 & (uint)fVar204);
            fVar218 = (float)((uint)fVar160 & uVar66 | ~uVar66 & (uint)fVar206);
            fVar220 = (float)((uint)fVar161 & uVar67 | ~uVar67 & (uint)fVar207);
            fVar227 = (float)((uint)fVar173 & uVar68 | ~uVar68 & (uint)fVar208);
            fVar235 = (float)((uint)fVar234 & uVar64 | ~uVar64 & (uint)fVar209);
            fVar223 = (float)((uint)fVar272 & uVar66 | ~uVar66 & (uint)fVar285);
            fVar226 = (float)((uint)fVar225 & uVar67 | ~uVar67 & (uint)fVar287);
            fVar242 = (float)((uint)fVar236 & uVar68 | ~uVar68 & (uint)fVar249);
            fVar174 = (float)((uint)fVar103 & uVar64 | ~uVar64 & (uint)fVar274);
            fVar175 = (float)((uint)fVar105 & uVar66 | ~uVar66 & (uint)fVar71);
            fVar203 = (float)((uint)fVar107 & uVar67 | ~uVar67 & (uint)fVar133);
            fVar205 = (float)((uint)fVar131 & uVar68 | ~uVar68 & (uint)fVar136);
            fVar260 = (float)((uint)fVar204 & uVar64 | ~uVar64 & (uint)fVar147) - fVar245;
            fVar269 = (float)((uint)fVar206 & uVar66 | ~uVar66 & (uint)fVar160) - fVar273;
            fVar270 = (float)((uint)fVar207 & uVar67 | ~uVar67 & (uint)fVar161) - fVar250;
            fVar271 = (float)((uint)fVar208 & uVar68 | ~uVar68 & (uint)fVar173) - fVar258;
            fVar234 = (float)((uint)fVar209 & uVar64 | ~uVar64 & (uint)fVar234) - fVar101;
            fVar272 = (float)((uint)fVar285 & uVar66 | ~uVar66 & (uint)fVar272) - fVar134;
            fVar225 = (float)((uint)fVar287 & uVar67 | ~uVar67 & (uint)fVar225) - fVar143;
            fVar236 = (float)((uint)fVar249 & uVar68 | ~uVar68 & (uint)fVar236) - fVar145;
            fVar279 = (float)((uint)fVar274 & uVar64 | ~uVar64 & (uint)fVar103) - fVar130;
            fVar280 = (float)((uint)fVar71 & uVar66 | ~uVar66 & (uint)fVar105) - fVar132;
            fVar281 = (float)((uint)fVar133 & uVar67 | ~uVar67 & (uint)fVar107) - fVar135;
            fVar204 = (float)((uint)fVar136 & uVar68 | ~uVar68 & (uint)fVar131) - fVar142;
            fVar285 = fVar245 - fVar210;
            fVar287 = fVar273 - fVar218;
            fVar289 = fVar250 - fVar220;
            fVar291 = fVar258 - fVar227;
            fVar144 = fVar101 - fVar235;
            fVar70 = fVar134 - fVar223;
            fVar100 = fVar143 - fVar226;
            fVar106 = fVar145 - fVar242;
            fVar147 = fVar130 - fVar174;
            fVar160 = fVar132 - fVar175;
            fVar161 = fVar135 - fVar203;
            fVar173 = fVar142 - fVar205;
            fVar206 = (fVar101 * fVar279 - fVar130 * fVar234) * 0.0 +
                      (fVar130 * fVar260 - fVar245 * fVar279) * 0.0 +
                      (fVar245 * fVar234 - fVar101 * fVar260);
            fVar207 = (fVar134 * fVar280 - fVar132 * fVar272) * 0.0 +
                      (fVar132 * fVar269 - fVar273 * fVar280) * 0.0 +
                      (fVar273 * fVar272 - fVar134 * fVar269);
            auVar158._4_4_ = fVar207;
            auVar158._0_4_ = fVar206;
            fVar208 = (fVar143 * fVar281 - fVar135 * fVar225) * 0.0 +
                      (fVar135 * fVar270 - fVar250 * fVar281) * 0.0 +
                      (fVar250 * fVar225 - fVar143 * fVar270);
            fVar209 = (fVar145 * fVar204 - fVar142 * fVar236) * 0.0 +
                      (fVar142 * fVar271 - fVar258 * fVar204) * 0.0 +
                      (fVar258 * fVar236 - fVar145 * fVar271);
            auVar284._0_4_ =
                 (fVar235 * fVar147 - fVar174 * fVar144) * 0.0 +
                 (fVar174 * fVar285 - fVar210 * fVar147) * 0.0 +
                 (fVar210 * fVar144 - fVar235 * fVar285);
            auVar284._4_4_ =
                 (fVar223 * fVar160 - fVar175 * fVar70) * 0.0 +
                 (fVar175 * fVar287 - fVar218 * fVar160) * 0.0 +
                 (fVar218 * fVar70 - fVar223 * fVar287);
            auVar284._8_4_ =
                 (fVar226 * fVar161 - fVar203 * fVar100) * 0.0 +
                 (fVar203 * fVar289 - fVar220 * fVar161) * 0.0 +
                 (fVar220 * fVar100 - fVar226 * fVar289);
            auVar284._12_4_ =
                 (fVar242 * fVar173 - fVar205 * fVar106) * 0.0 +
                 (fVar205 * fVar291 - fVar227 * fVar173) * 0.0 +
                 (fVar227 * fVar106 - fVar242 * fVar291);
            auVar158._8_4_ = fVar208;
            auVar158._12_4_ = fVar209;
            auVar72 = maxps(auVar158,auVar284);
            bVar46 = auVar72._0_4_ <= 0.0 && bVar46;
            auVar159._0_4_ = -(uint)bVar46;
            bVar47 = auVar72._4_4_ <= 0.0 && bVar47;
            auVar159._4_4_ = -(uint)bVar47;
            bVar48 = auVar72._8_4_ <= 0.0 && bVar48;
            auVar159._8_4_ = -(uint)bVar48;
            bVar49 = auVar72._12_4_ <= 0.0 && bVar49;
            auVar159._12_4_ = -(uint)bVar49;
            iVar50 = movmskps((int)(bspline_basis1 + lVar22),auVar159);
            if (iVar50 == 0) {
LAB_00b0cd10:
              auVar141._8_8_ = uStack_3b0;
              auVar141._0_8_ = local_3b8;
            }
            else {
              fVar175 = fVar144 * fVar279 - fVar147 * fVar234;
              fVar203 = fVar70 * fVar280 - fVar160 * fVar272;
              fVar205 = fVar100 * fVar281 - fVar161 * fVar225;
              fVar210 = fVar106 * fVar204 - fVar173 * fVar236;
              fVar174 = fVar147 * fVar260 - fVar279 * fVar285;
              fVar160 = fVar160 * fVar269 - fVar280 * fVar287;
              fVar161 = fVar161 * fVar270 - fVar281 * fVar289;
              fVar173 = fVar173 * fVar271 - fVar204 * fVar291;
              fVar144 = fVar285 * fVar234 - fVar144 * fVar260;
              fVar218 = fVar287 * fVar272 - fVar70 * fVar269;
              fVar220 = fVar289 * fVar225 - fVar100 * fVar270;
              fVar227 = fVar291 * fVar236 - fVar106 * fVar271;
              auVar140._0_4_ = fVar174 * 0.0 + fVar144;
              auVar140._4_4_ = fVar160 * 0.0 + fVar218;
              auVar140._8_4_ = fVar161 * 0.0 + fVar220;
              auVar140._12_4_ = fVar173 * 0.0 + fVar227;
              auVar202._0_4_ = fVar175 * 0.0 + auVar140._0_4_;
              auVar202._4_4_ = fVar203 * 0.0 + auVar140._4_4_;
              auVar202._8_4_ = fVar205 * 0.0 + auVar140._8_4_;
              auVar202._12_4_ = fVar210 * 0.0 + auVar140._12_4_;
              auVar72 = rcpps(auVar140,auVar202);
              fVar70 = auVar72._0_4_;
              fVar100 = auVar72._4_4_;
              fVar106 = auVar72._8_4_;
              fVar147 = auVar72._12_4_;
              fVar70 = (1.0 - auVar202._0_4_ * fVar70) * fVar70 + fVar70;
              fVar100 = (1.0 - auVar202._4_4_ * fVar100) * fVar100 + fVar100;
              fVar106 = (1.0 - auVar202._8_4_ * fVar106) * fVar106 + fVar106;
              fVar147 = (1.0 - auVar202._12_4_ * fVar147) * fVar147 + fVar147;
              fVar130 = (fVar130 * fVar144 + fVar101 * fVar174 + fVar245 * fVar175) * fVar70;
              fVar132 = (fVar132 * fVar218 + fVar134 * fVar160 + fVar273 * fVar203) * fVar100;
              fVar135 = (fVar135 * fVar220 + fVar143 * fVar161 + fVar250 * fVar205) * fVar106;
              fVar142 = (fVar142 * fVar227 + fVar145 * fVar173 + fVar258 * fVar210) * fVar147;
              fVar144 = *(float *)(ray + k * 4 + 0x80);
              bVar46 = ((float)local_288._0_4_ <= fVar130 && fVar130 <= fVar144) && bVar46;
              auVar171._0_4_ = -(uint)bVar46;
              bVar47 = ((float)local_288._4_4_ <= fVar132 && fVar132 <= fVar144) && bVar47;
              auVar171._4_4_ = -(uint)bVar47;
              bVar48 = (fStack_280 <= fVar135 && fVar135 <= fVar144) && bVar48;
              auVar171._8_4_ = -(uint)bVar48;
              bVar49 = (fStack_27c <= fVar142 && fVar142 <= fVar144) && bVar49;
              auVar171._12_4_ = -(uint)bVar49;
              iVar50 = movmskps(iVar50,auVar171);
              if (iVar50 == 0) goto LAB_00b0cd10;
              auVar172._0_8_ =
                   CONCAT44(-(uint)(auVar202._4_4_ != 0.0 && bVar47),
                            -(uint)(auVar202._0_4_ != 0.0 && bVar46));
              auVar172._8_4_ = -(uint)(auVar202._8_4_ != 0.0 && bVar48);
              auVar172._12_4_ = -(uint)(auVar202._12_4_ != 0.0 && bVar49);
              iVar50 = movmskps(iVar50,auVar172);
              auVar141._8_8_ = uStack_3b0;
              auVar141._0_8_ = local_3b8;
              if (iVar50 != 0) {
                fVar206 = fVar206 * fVar70;
                fVar207 = fVar207 * fVar100;
                fVar208 = fVar208 * fVar106;
                fVar209 = fVar209 * fVar147;
                local_4b8 = (float)((uint)(1.0 - fVar206) & uVar64 | ~uVar64 & (uint)fVar206);
                fStack_4b4 = (float)((uint)(1.0 - fVar207) & uVar66 | ~uVar66 & (uint)fVar207);
                fStack_4b0 = (float)((uint)(1.0 - fVar208) & uVar67 | ~uVar67 & (uint)fVar208);
                fStack_4ac = (float)((uint)(1.0 - fVar209) & uVar68 | ~uVar68 & (uint)fVar209);
                local_278 = (float)(~uVar64 & (uint)(auVar284._0_4_ * fVar70) |
                                   (uint)(1.0 - auVar284._0_4_ * fVar70) & uVar64);
                fStack_274 = (float)(~uVar66 & (uint)(auVar284._4_4_ * fVar100) |
                                    (uint)(1.0 - auVar284._4_4_ * fVar100) & uVar66);
                fStack_270 = (float)(~uVar67 & (uint)(auVar284._8_4_ * fVar106) |
                                    (uint)(1.0 - auVar284._8_4_ * fVar106) & uVar67);
                fStack_26c = (float)(~uVar68 & (uint)(auVar284._12_4_ * fVar147) |
                                    (uint)(1.0 - auVar284._12_4_ * fVar147) & uVar68);
                auVar141._8_4_ = auVar172._8_4_;
                auVar141._0_8_ = auVar172._0_8_;
                auVar141._12_4_ = auVar172._12_4_;
                local_4c8 = fVar130;
                fStack_4c4 = fVar132;
                fStack_4c0 = fVar135;
                fStack_4bc = fVar142;
              }
            }
            iVar50 = movmskps(iVar50,auVar141);
            fVar144 = local_398;
            fVar70 = fStack_394;
            fVar100 = fStack_390;
            fVar106 = fStack_38c;
            fStack_2d0 = fVar257;
            fStack_2cc = fVar259;
            _local_258 = auVar217;
            if (iVar50 != 0) {
              fVar132 = (auVar283._0_4_ - auVar127._0_4_) * local_4b8 + auVar127._0_4_;
              fVar135 = (auVar283._4_4_ - auVar127._4_4_) * fStack_4b4 + auVar127._4_4_;
              fVar142 = (auVar283._8_4_ - auVar127._8_4_) * fStack_4b0 + auVar127._8_4_;
              fVar147 = (auVar283._12_4_ - auVar127._12_4_) * fStack_4ac + auVar127._12_4_;
              fVar130 = *(float *)((long)local_320->ray_space + k * 4 + -0x10);
              auVar96._0_4_ = -(uint)(fVar130 * (fVar132 + fVar132) < local_4c8) & auVar141._0_4_;
              auVar96._4_4_ = -(uint)(fVar130 * (fVar135 + fVar135) < fStack_4c4) & auVar141._4_4_;
              auVar96._8_4_ = -(uint)(fVar130 * (fVar142 + fVar142) < fStack_4c0) & auVar141._8_4_;
              auVar96._12_4_ = -(uint)(fVar130 * (fVar147 + fVar147) < fStack_4bc) & auVar141._12_4_
              ;
              uVar64 = movmskps((int)local_320,auVar96);
              if (uVar64 != 0) {
                local_278 = local_278 + local_278 + -1.0;
                fStack_274 = fStack_274 + fStack_274 + -1.0;
                fStack_270 = fStack_270 + fStack_270 + -1.0;
                fStack_26c = fStack_26c + fStack_26c + -1.0;
                local_188 = CONCAT44(fStack_2a4,local_2a8);
                uStack_180 = CONCAT44(fStack_29c,fStack_2a0);
                local_178 = CONCAT44(fStack_2b4,local_2b8);
                uStack_170 = CONCAT44(fStack_2ac,fStack_2b0);
                local_168 = CONCAT44(fStack_2c4,local_2c8);
                uStack_160 = CONCAT44(fStack_2bc,fStack_2c0);
                local_158 = CONCAT44(fStack_294,local_298);
                uStack_150 = CONCAT44(fStack_28c,fStack_290);
                pGVar58 = (context->scene->geometries).items[local_3c0].ptr;
                local_1c8 = local_4b8;
                fStack_1c4 = fStack_4b4;
                fStack_1c0 = fStack_4b0;
                fStack_1bc = fStack_4ac;
                local_1b8 = local_278;
                fStack_1b4 = fStack_274;
                fStack_1b0 = fStack_270;
                fStack_1ac = fStack_26c;
                local_1a8 = local_4c8;
                fStack_1a4 = fStack_4c4;
                fStack_1a0 = fStack_4c0;
                fStack_19c = fStack_4bc;
                local_198 = uVar65;
                local_148 = auVar96;
                if ((pGVar58->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  puVar56 = (undefined1 *)0x0;
                  local_194 = iVar18;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (puVar56 = (undefined1 *)CONCAT71((int7)((ulong)context->args >> 8),1),
                        local_194 = iVar18, pGVar58->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar144 = (float)(int)uVar65;
                  local_138[0] = (fVar144 + local_4b8 + 0.0) * local_78;
                  local_138[1] = (fVar144 + fStack_4b4 + 1.0) * fStack_74;
                  local_138[2] = (fVar144 + fStack_4b0 + 2.0) * fStack_70;
                  local_138[3] = (fVar144 + fStack_4ac + 3.0) * fStack_6c;
                  local_128 = CONCAT44(fStack_274,local_278);
                  uStack_120 = CONCAT44(fStack_26c,fStack_270);
                  local_118[0] = local_4c8;
                  local_118[1] = fStack_4c4;
                  local_118[2] = fStack_4c0;
                  local_118[3] = fStack_4bc;
                  uVar61 = (ulong)(uVar64 & 0xff);
                  uVar59 = 0;
                  if (uVar61 != 0) {
                    for (; ((uVar64 & 0xff) >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                    }
                  }
                  auVar72 = *local_328;
                  uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_194 = iVar18;
                  do {
                    local_d8 = local_138[uVar59];
                    local_c8 = *(undefined4 *)((long)&local_128 + uVar59 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_118[uVar59];
                    fVar106 = 1.0 - local_d8;
                    fVar144 = local_d8 * fVar106 * 4.0;
                    fVar130 = (fVar106 * fVar106 + fVar144) * 0.5;
                    fVar100 = local_d8 * local_d8 * 0.5;
                    fVar70 = (-local_d8 * local_d8 - fVar144) * 0.5;
                    local_318.context = context->user;
                    fVar144 = -fVar106 * fVar106 * 0.5;
                    local_108 = fVar144 * local_2a8 +
                                fVar70 * local_2b8 + fVar130 * local_2c8 + fVar100 * local_298;
                    local_f8 = fVar144 * fStack_2a4 +
                               fVar70 * fStack_2b4 + fVar130 * fStack_2c4 + fVar100 * fStack_294;
                    local_e8 = fVar144 * fStack_2a0 +
                               fVar70 * fStack_2b0 + fVar130 * fStack_2c0 + fVar100 * fStack_290;
                    fStack_104 = local_108;
                    fStack_100 = local_108;
                    fStack_fc = local_108;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    uStack_c4 = local_c8;
                    uStack_c0 = local_c8;
                    uStack_bc = local_c8;
                    local_b8 = CONCAT44(uStack_64,local_68);
                    uStack_b0 = CONCAT44(uStack_5c,uStack_60);
                    local_a8 = local_2e8._0_8_;
                    uStack_a0 = local_2e8._8_8_;
                    local_98 = (local_318.context)->instID[0];
                    uStack_94 = local_98;
                    uStack_90 = local_98;
                    uStack_8c = local_98;
                    local_88 = (local_318.context)->instPrimID[0];
                    uStack_84 = local_88;
                    uStack_80 = local_88;
                    uStack_7c = local_88;
                    local_318.valid = (int *)local_3d8;
                    pRVar55 = (RTCIntersectArguments *)pGVar58->userPtr;
                    local_318.hit = (RTCHitN *)&local_108;
                    local_318.N = 4;
                    p_Var52 = pGVar58->occlusionFilterN;
                    local_3d8 = auVar72;
                    local_318.geometryUserPtr = pRVar55;
                    local_318.ray = (RTCRayN *)ray;
                    if (p_Var52 != (RTCFilterFunctionN)0x0) {
                      p_Var52 = (RTCFilterFunctionN)(*p_Var52)(&local_318);
                    }
                    auVar128._0_4_ = -(uint)(local_3d8._0_4_ == 0);
                    auVar128._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                    auVar128._8_4_ = -(uint)(local_3d8._8_4_ == 0);
                    auVar128._12_4_ = -(uint)(local_3d8._12_4_ == 0);
                    uVar64 = movmskps((int)p_Var52,auVar128);
                    pRVar53 = (RTCRayN *)(ulong)(uVar64 ^ 0xf);
                    if ((uVar64 ^ 0xf) == 0) {
                      auVar128 = auVar128 ^ _DAT_01f7ae20;
                    }
                    else {
                      pRVar55 = context->args;
                      if ((pRVar55->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar55->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar58->field_8).field_0x2 & 0x40) != 0)))) {
                        (*pRVar55->filter)(&local_318);
                      }
                      auVar97._0_4_ = -(uint)(local_3d8._0_4_ == 0);
                      auVar97._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                      auVar97._8_4_ = -(uint)(local_3d8._8_4_ == 0);
                      auVar97._12_4_ = -(uint)(local_3d8._12_4_ == 0);
                      auVar128 = auVar97 ^ _DAT_01f7ae20;
                      *(undefined1 (*) [16])(local_318.ray + 0x80) =
                           ~auVar97 & _DAT_01f7aa00 |
                           *(undefined1 (*) [16])(local_318.ray + 0x80) & auVar97;
                      pRVar53 = local_318.ray;
                    }
                    auVar129._0_4_ = auVar128._0_4_ << 0x1f;
                    auVar129._4_4_ = auVar128._4_4_ << 0x1f;
                    auVar129._8_4_ = auVar128._8_4_ << 0x1f;
                    auVar129._12_4_ = auVar128._12_4_ << 0x1f;
                    iVar50 = movmskps((int)pRVar53,auVar129);
                    if (iVar50 != 0) {
                      puVar56 = (undefined1 *)CONCAT71((int7)((ulong)pRVar55 >> 8),1);
                      break;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar54;
                    uVar61 = uVar61 ^ 1L << (uVar59 & 0x3f);
                    uVar59 = 0;
                    if (uVar61 != 0) {
                      for (; (uVar61 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                      }
                    }
                    puVar56 = (undefined1 *)0x0;
                  } while (uVar61 != 0);
                }
                bVar60 = (bool)(bVar60 | (byte)puVar56);
                fVar144 = local_398;
                fVar70 = fStack_394;
                fVar100 = fStack_390;
                fVar106 = fStack_38c;
              }
            }
          }
          fStack_38c = fVar106;
          fStack_390 = fVar100;
          fStack_394 = fVar70;
          local_398 = fVar144;
          uVar54 = SUB84(puVar56,0);
          lVar62 = lVar62 + 4;
        } while ((int)lVar62 < iVar18);
      }
      if (bVar60 != false) {
        return bVar60;
      }
      fVar144 = *(float *)(ray + k * 4 + 0x80);
      auVar126._4_4_ = -(uint)(fStack_44 <= fVar144);
      auVar126._0_4_ = -(uint)(local_48 <= fVar144);
      auVar126._8_4_ = -(uint)(fStack_40 <= fVar144);
      auVar126._12_4_ = -(uint)(fStack_3c <= fVar144);
      uVar64 = movmskps(uVar54,auVar126);
      uVar63 = uVar63 & uVar63 + 0xf & uVar64;
    } while (uVar63 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }